

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_hardswish(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_type gVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  ggml_tensor *pgVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  byte bVar30;
  char cVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong in_RCX;
  char *pcVar38;
  long lVar39;
  long lVar40;
  ushort uVar41;
  undefined8 uVar42;
  ggml_tensor *pgVar43;
  ggml_tensor *pgVar44;
  ggml_tensor *pgVar45;
  ggml_tensor *pgVar46;
  uint uVar47;
  ggml_tensor *pgVar48;
  ggml_tensor *pgVar49;
  ulong uVar50;
  long in_R9;
  ulong uVar51;
  int64_t ir;
  long lVar52;
  long lVar53;
  ggml_tensor *src0;
  long lVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  anon_union_4_2_947300a4 u;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auStack_480 [64];
  undefined8 uStack_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  ggml_tensor *pgStack_308;
  ggml_tensor *pgStack_300;
  ggml_tensor *pgStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  size_t sStack_2e0;
  size_t sStack_2d8;
  size_t sStack_2d0;
  size_t sStack_2c8;
  size_t sStack_2c0;
  size_t sStack_2b8;
  ggml_tensor *pgStack_2b0;
  ggml_tensor *pgStack_2a8;
  size_t sStack_2a0;
  ggml_tensor *pgStack_298;
  ggml_tensor *pgStack_290;
  ggml_tensor *pgStack_288;
  ggml_tensor *pgStack_280;
  ggml_tensor *pgStack_278;
  ggml_tensor *pgStack_270;
  long lStack_268;
  long lStack_260;
  size_t sStack_258;
  size_t sStack_250;
  size_t sStack_248;
  size_t sStack_240;
  size_t sStack_238;
  size_t sStack_230;
  ggml_tensor *pgStack_228;
  ggml_tensor *pgStack_220;
  size_t sStack_218;
  ggml_tensor *pgStack_210;
  ggml_tensor *pgStack_208;
  ggml_tensor *pgStack_200;
  ggml_tensor *pgStack_1f8;
  ggml_tensor *pgStack_1f0;
  ggml_tensor *pgStack_1e8;
  long lStack_1e0;
  long lStack_1d8;
  size_t sStack_1d0;
  size_t sStack_1c8;
  size_t sStack_1c0;
  size_t sStack_1b8;
  size_t sStack_1b0;
  size_t sStack_1a8;
  ggml_tensor *pgStack_1a0;
  ggml_tensor *pgStack_198;
  size_t sStack_190;
  ggml_tensor *pgStack_188;
  ggml_tensor *pgStack_180;
  ggml_tensor *pgStack_178;
  ggml_tensor *pgStack_170;
  ggml_tensor *pgStack_168;
  ggml_tensor *pgStack_160;
  long lStack_158;
  long lStack_150;
  size_t sStack_148;
  size_t sStack_140;
  size_t sStack_138;
  size_t sStack_130;
  size_t sStack_128;
  size_t sStack_120;
  ggml_tensor *pgStack_118;
  ggml_tensor *pgStack_110;
  size_t sStack_108;
  ggml_tensor *pgStack_100;
  ggml_tensor *pgStack_f8;
  
  pgVar6 = dst->src[0];
  gVar2 = pgVar6->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar31 = ggml_is_contiguous_1(pgVar6);
    if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(dst), cVar31 != '\0')) &&
       (cVar31 = ggml_are_same_shape(pgVar6,dst), cVar31 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012e6c9;
      if (pgVar6->nb[0] == 4) {
        lVar40 = pgVar6->ne[1];
        lVar53 = pgVar6->ne[2];
        sVar7 = pgVar6->nb[1];
        sVar8 = pgVar6->nb[2];
        sVar9 = pgVar6->nb[3];
        lVar37 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar3 = params->ith;
        iVar4 = params->nth;
        lVar33 = ggml_nrows(pgVar6);
        lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
        lVar52 = iVar3 * lVar34;
        lVar34 = lVar34 + lVar52;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar52) {
          return;
        }
        lVar53 = lVar53 * lVar40;
        pvVar13 = dst->data;
        pvVar14 = pgVar6->data;
        do {
          lVar33 = lVar52 / lVar53;
          lVar39 = lVar52 % lVar53;
          lVar35 = lVar39 / lVar40;
          lVar39 = lVar39 % lVar40;
          if (0 < lVar37) {
            lVar36 = 0;
            do {
              fVar66 = *(float *)((long)pvVar14 +
                                 lVar36 * 4 + lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9);
              auVar72._0_4_ = (fVar66 + 3.0) / 6.0;
              auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar69 = vmaxss_avx(auVar72,ZEXT816(0) << 0x40);
              auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
              *(float *)((long)pvVar13 +
                        lVar36 * 4 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12) =
                   fVar66 * auVar69._0_4_;
              lVar36 = lVar36 + 1;
            } while (lVar37 != lVar36);
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 != lVar34);
        return;
      }
LAB_0012e6e5:
      pcVar38 = "nb00 == sizeof(src0_t)";
      uVar42 = 0x56;
      goto LAB_0012e6ff;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar31 = ggml_is_contiguous_1(pgVar6);
    if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(dst), cVar31 != '\0')) &&
       (cVar31 = ggml_are_same_shape(pgVar6,dst), cVar31 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar6->nb[0] == 2) {
          lVar40 = pgVar6->ne[1];
          lVar53 = pgVar6->ne[2];
          sVar7 = pgVar6->nb[1];
          sVar8 = pgVar6->nb[2];
          sVar9 = pgVar6->nb[3];
          lVar37 = dst->ne[0];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows();
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar52 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar52;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar52) {
            return;
          }
          lVar53 = lVar53 * lVar40;
          do {
            lVar33 = lVar52 % lVar53;
            if (0 < lVar37) {
              lVar35 = 0;
              do {
                auVar70._0_4_ =
                     (*(float *)(&ggml_table_f32_f16 +
                                (ulong)*(ushort *)
                                        ((long)pgVar6->data +
                                        lVar35 * 2 +
                                        (lVar33 / lVar40) * sVar8 +
                                        (lVar33 % lVar40) * sVar7 + (lVar52 / lVar53) * sVar9) * 4)
                     + 3.0) / 6.0;
                auVar70._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar69 = vmaxss_avx(auVar70,ZEXT816(0) << 0x40);
                auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                auVar69 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgVar6->data +
                                                                          lVar35 * 2 +
                                                                          (lVar33 / lVar40) * sVar8
                                                                          + (lVar33 % lVar40) *
                                                                            sVar7 + (lVar52 / lVar53
                                                                                    ) * sVar9) * 4)
                                                       * auVar69._0_4_)),0);
                vpextrw_avx(auVar69,0);
                lVar35 = lVar35 + 1;
              } while (lVar37 != lVar35);
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 != lVar34);
          return;
        }
        goto LAB_0012e6e5;
      }
      goto LAB_0012e6c9;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar5 = dst->type;
    in_RCX = (ulong)gVar5;
    if (gVar5 == GGML_TYPE_F32) {
      cVar31 = ggml_is_contiguous_1(pgVar6);
      if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(dst), cVar31 != '\0')) &&
         (cVar31 = ggml_are_same_shape(pgVar6,dst), cVar31 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar6->nb[0] == 2) {
            lVar40 = pgVar6->ne[1];
            lVar53 = pgVar6->ne[2];
            sVar7 = pgVar6->nb[1];
            sVar8 = pgVar6->nb[2];
            sVar9 = pgVar6->nb[3];
            lVar37 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar6);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar52 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar53 = lVar53 * lVar40;
            pvVar13 = dst->data;
            pvVar14 = pgVar6->data;
            auVar65 = vpbroadcastq_avx512f();
            auVar61 = vbroadcastss_avx512f(ZEXT416(0x40400000));
            auVar62 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
            auVar63 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar64 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            do {
              lVar33 = lVar52 / lVar53;
              lVar39 = lVar52 % lVar53;
              lVar35 = lVar39 / lVar40;
              lVar39 = lVar39 % lVar40;
              if (0 < lVar37) {
                uVar51 = 0;
                do {
                  auVar59 = vpbroadcastq_avx512f();
                  auVar60 = vporq_avx512f(auVar59,auVar63);
                  auVar59 = vporq_avx512f(auVar59,auVar64);
                  uVar42 = vpcmpuq_avx512f(auVar59,auVar65,2);
                  bVar29 = (byte)uVar42;
                  uVar42 = vpcmpuq_avx512f(auVar60,auVar65,2);
                  bVar30 = (byte)uVar42;
                  uVar41 = CONCAT11(bVar30,bVar29);
                  auVar57 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                ((long)pvVar14 +
                                                uVar51 * 2 +
                                                lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9));
                  auVar55._2_2_ = (ushort)((byte)(uVar41 >> 1) & 1) * auVar57._2_2_;
                  auVar55._0_2_ = (ushort)(bVar29 & 1) * auVar57._0_2_;
                  auVar55._4_2_ = (ushort)((byte)(uVar41 >> 2) & 1) * auVar57._4_2_;
                  auVar55._6_2_ = (ushort)((byte)(uVar41 >> 3) & 1) * auVar57._6_2_;
                  auVar55._8_2_ = (ushort)((byte)(uVar41 >> 4) & 1) * auVar57._8_2_;
                  auVar55._10_2_ = (ushort)((byte)(uVar41 >> 5) & 1) * auVar57._10_2_;
                  auVar55._12_2_ = (ushort)((byte)(uVar41 >> 6) & 1) * auVar57._12_2_;
                  auVar55._14_2_ = (ushort)((byte)(uVar41 >> 7) & 1) * auVar57._14_2_;
                  auVar55._16_2_ = (ushort)(bVar30 & 1) * auVar57._16_2_;
                  auVar55._18_2_ = (ushort)(bVar30 >> 1 & 1) * auVar57._18_2_;
                  auVar55._20_2_ = (ushort)(bVar30 >> 2 & 1) * auVar57._20_2_;
                  auVar55._22_2_ = (ushort)(bVar30 >> 3 & 1) * auVar57._22_2_;
                  auVar55._24_2_ = (ushort)(bVar30 >> 4 & 1) * auVar57._24_2_;
                  auVar55._26_2_ = (ushort)(bVar30 >> 5 & 1) * auVar57._26_2_;
                  auVar55._28_2_ = (ushort)(bVar30 >> 6 & 1) * auVar57._28_2_;
                  auVar55._30_2_ = (ushort)(bVar30 >> 7) * auVar57._30_2_;
                  auVar59 = vpmovzxwd_avx512f(auVar55);
                  auVar59 = vpslld_avx512f(auVar59,0x10);
                  auVar60 = vaddps_avx512f(auVar59,auVar61);
                  auVar60 = vdivps_avx512f(auVar60,auVar62);
                  auVar60 = vmaxps_avx512f(auVar60,ZEXT1664(ZEXT816(0) << 0x40));
                  auVar60 = vminps_avx512f(auVar60,auVar58);
                  auVar59 = vmulps_avx512f(auVar60,auVar59);
                  puVar1 = (uint *)((long)pvVar13 +
                                   uVar51 * 4 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12)
                  ;
                  bVar16 = (bool)((byte)(uVar41 >> 1) & 1);
                  bVar17 = (bool)((byte)(uVar41 >> 2) & 1);
                  bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
                  bVar19 = (bool)((byte)(uVar41 >> 4) & 1);
                  bVar20 = (bool)((byte)(uVar41 >> 5) & 1);
                  bVar21 = (bool)((byte)(uVar41 >> 6) & 1);
                  bVar22 = (bool)((byte)(uVar41 >> 7) & 1);
                  bVar23 = (bool)(bVar30 >> 1 & 1);
                  bVar24 = (bool)(bVar30 >> 2 & 1);
                  bVar25 = (bool)(bVar30 >> 3 & 1);
                  bVar26 = (bool)(bVar30 >> 4 & 1);
                  bVar27 = (bool)(bVar30 >> 5 & 1);
                  bVar28 = (bool)(bVar30 >> 6 & 1);
                  *puVar1 = (uint)(bVar29 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar29 & 1) * *puVar1
                  ;
                  puVar1[1] = (uint)bVar16 * auVar59._4_4_ | (uint)!bVar16 * puVar1[1];
                  puVar1[2] = (uint)bVar17 * auVar59._8_4_ | (uint)!bVar17 * puVar1[2];
                  puVar1[3] = (uint)bVar18 * auVar59._12_4_ | (uint)!bVar18 * puVar1[3];
                  puVar1[4] = (uint)bVar19 * auVar59._16_4_ | (uint)!bVar19 * puVar1[4];
                  puVar1[5] = (uint)bVar20 * auVar59._20_4_ | (uint)!bVar20 * puVar1[5];
                  puVar1[6] = (uint)bVar21 * auVar59._24_4_ | (uint)!bVar21 * puVar1[6];
                  puVar1[7] = (uint)bVar22 * auVar59._28_4_ | (uint)!bVar22 * puVar1[7];
                  puVar1[8] = (uint)(bVar30 & 1) * auVar59._32_4_ |
                              (uint)!(bool)(bVar30 & 1) * puVar1[8];
                  puVar1[9] = (uint)bVar23 * auVar59._36_4_ | (uint)!bVar23 * puVar1[9];
                  puVar1[10] = (uint)bVar24 * auVar59._40_4_ | (uint)!bVar24 * puVar1[10];
                  puVar1[0xb] = (uint)bVar25 * auVar59._44_4_ | (uint)!bVar25 * puVar1[0xb];
                  puVar1[0xc] = (uint)bVar26 * auVar59._48_4_ | (uint)!bVar26 * puVar1[0xc];
                  puVar1[0xd] = (uint)bVar27 * auVar59._52_4_ | (uint)!bVar27 * puVar1[0xd];
                  puVar1[0xe] = (uint)bVar28 * auVar59._56_4_ | (uint)!bVar28 * puVar1[0xe];
                  puVar1[0xf] = (uint)(bVar30 >> 7) * auVar59._60_4_ |
                                (uint)!(bool)(bVar30 >> 7) * puVar1[0xf];
                  uVar51 = uVar51 + 0x10;
                } while ((lVar37 + 0xfU & 0xfffffffffffffff0) != uVar51);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
          goto LAB_0012e6e5;
        }
        goto LAB_0012e6c9;
      }
    }
    else {
      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012e170;
      cVar31 = ggml_is_contiguous_1(pgVar6);
      if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(dst), cVar31 != '\0')) &&
         (cVar31 = ggml_are_same_shape(pgVar6,dst), cVar31 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar6->nb[0] == 2) {
            lVar40 = pgVar6->ne[1];
            lVar53 = pgVar6->ne[2];
            sVar7 = pgVar6->nb[1];
            sVar8 = pgVar6->nb[2];
            sVar9 = pgVar6->nb[3];
            lVar37 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar33 = ggml_nrows(pgVar6);
            lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
            lVar52 = iVar3 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar53 = lVar53 * lVar40;
            pvVar13 = dst->data;
            pvVar14 = pgVar6->data;
            do {
              lVar33 = lVar52 / lVar53;
              lVar39 = lVar52 % lVar53;
              lVar35 = lVar39 / lVar40;
              lVar39 = lVar39 % lVar40;
              if (0 < lVar37) {
                lVar36 = 0;
                do {
                  fVar66 = (float)((uint)*(ushort *)
                                          ((long)pvVar14 +
                                          lVar36 * 2 +
                                          lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) << 0x10)
                  ;
                  auVar71._0_4_ = (fVar66 + 3.0) / 6.0;
                  auVar71._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar69 = vmaxss_avx(auVar71,ZEXT816(0) << 0x40);
                  auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                  fVar66 = auVar69._0_4_ * fVar66;
                  if ((uint)ABS(fVar66) < 0x7f800001) {
                    uVar41 = (ushort)((int)fVar66 + 0x7fff + ((uint)fVar66 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar13 + lVar36 * 2 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12
                   ) = uVar41;
                  lVar36 = lVar36 + 1;
                } while (lVar37 != lVar36);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
          goto LAB_0012e6e5;
        }
        goto LAB_0012e6c9;
      }
    }
  }
  else {
LAB_0012e170:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      pgVar43 = pgVar6;
      ggml_compute_forward_hardswish_cold_1();
      pgVar46 = pgVar43->src[0];
      gVar2 = pgVar46->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
        cVar31 = ggml_is_contiguous_1(pgVar46);
        if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(pgVar43), cVar31 != '\0')) &&
           (cVar31 = ggml_are_same_shape(pgVar46,pgVar43), cVar31 != '\0')) {
          if (pgVar43->nb[0] != 4) goto LAB_0012ef51;
          if (pgVar46->nb[0] == 4) {
            lVar40 = pgVar46->ne[1];
            lVar53 = pgVar46->ne[2];
            sVar7 = pgVar46->nb[1];
            sVar8 = pgVar46->nb[2];
            sVar9 = pgVar46->nb[3];
            lVar37 = pgVar43->ne[0];
            sVar10 = pgVar43->nb[1];
            sVar11 = pgVar43->nb[2];
            sVar12 = pgVar43->nb[3];
            gVar2 = dst->type;
            iVar3 = *(int *)&dst->field_0x4;
            lVar33 = ggml_nrows();
            lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
            lVar52 = (int)gVar2 * lVar34;
            lVar34 = lVar34 + lVar52;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar34 <= lVar52) {
              return;
            }
            lVar53 = lVar53 * lVar40;
            pvVar13 = pgVar43->data;
            pvVar14 = pgVar46->data;
            do {
              lVar33 = lVar52 / lVar53;
              lVar39 = lVar52 % lVar53;
              lVar35 = lVar39 / lVar40;
              lVar39 = lVar39 % lVar40;
              if (0 < lVar37) {
                lVar36 = 0;
                do {
                  fVar66 = *(float *)((long)pvVar14 +
                                     lVar36 * 4 + lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9);
                  *(float *)((long)pvVar13 +
                            lVar36 * 4 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12) =
                       fVar66 * fVar66;
                  lVar36 = lVar36 + 1;
                } while (lVar37 != lVar36);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
            return;
          }
LAB_0012ef6d:
          pcVar38 = "nb00 == sizeof(src0_t)";
          uVar42 = 0x56;
          goto LAB_0012ef87;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
        cVar31 = ggml_is_contiguous_1(pgVar46);
        if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(pgVar43), cVar31 != '\0')) &&
           (cVar31 = ggml_are_same_shape(pgVar46,pgVar43), cVar31 != '\0')) {
          if (pgVar43->nb[0] == 2) {
            if (pgVar46->nb[0] == 2) {
              lVar40 = pgVar46->ne[1];
              lVar53 = pgVar46->ne[2];
              sVar7 = pgVar46->nb[1];
              sVar8 = pgVar46->nb[2];
              sVar9 = pgVar46->nb[3];
              lVar37 = pgVar43->ne[0];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows();
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar52 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar52;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar34 <= lVar52) {
                return;
              }
              lVar53 = lVar53 * lVar40;
              do {
                lVar33 = lVar52 % lVar53;
                if (0 < lVar37) {
                  lVar35 = 0;
                  do {
                    auVar69 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&ggml_table_f32_f16 +
                                                                      (ulong)*(ushort *)
                                                                              ((long)pgVar46->data +
                                                                              lVar35 * 2 +
                                                                              (lVar33 / lVar40) *
                                                                              sVar8 + (lVar33 % 
                                                  lVar40) * sVar7 + (lVar52 / lVar53) * sVar9) * 4)
                                                  * *(float *)(&ggml_table_f32_f16 +
                                                              (ulong)*(ushort *)
                                                                      ((long)pgVar46->data +
                                                                      lVar35 * 2 +
                                                                      (lVar33 / lVar40) * sVar8 +
                                                                      (lVar33 % lVar40) * sVar7 +
                                                                      (lVar52 / lVar53) * sVar9) * 4
                                                              ))),0);
                    vpextrw_avx(auVar69,0);
                    lVar35 = lVar35 + 1;
                  } while (lVar37 != lVar35);
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 != lVar34);
              return;
            }
            goto LAB_0012ef6d;
          }
          goto LAB_0012ef51;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar5 = pgVar43->type;
        in_RCX = (ulong)gVar5;
        if (gVar5 == GGML_TYPE_F32) {
          cVar31 = ggml_is_contiguous_1(pgVar46);
          if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(pgVar43), cVar31 != '\0')) &&
             (cVar31 = ggml_are_same_shape(pgVar46,pgVar43), cVar31 != '\0')) {
            if (pgVar43->nb[0] == 4) {
              if (pgVar46->nb[0] == 2) {
                lVar40 = pgVar46->ne[1];
                lVar53 = pgVar46->ne[2];
                sVar7 = pgVar46->nb[1];
                sVar8 = pgVar46->nb[2];
                sVar9 = pgVar46->nb[3];
                lVar37 = pgVar43->ne[0];
                sVar10 = pgVar43->nb[1];
                sVar11 = pgVar43->nb[2];
                sVar12 = pgVar43->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar46);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar52 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar52;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar52) {
                  return;
                }
                lVar53 = lVar53 * lVar40;
                pvVar13 = pgVar43->data;
                pvVar14 = pgVar46->data;
                auVar65 = vpbroadcastq_avx512f();
                auVar61 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar62 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                do {
                  lVar33 = lVar52 / lVar53;
                  lVar39 = lVar52 % lVar53;
                  lVar35 = lVar39 / lVar40;
                  lVar39 = lVar39 % lVar40;
                  if (0 < lVar37) {
                    uVar51 = 0;
                    do {
                      auVar63 = vpbroadcastq_avx512f();
                      auVar64 = vporq_avx512f(auVar63,auVar61);
                      auVar63 = vporq_avx512f(auVar63,auVar62);
                      uVar42 = vpcmpuq_avx512f(auVar63,auVar65,2);
                      bVar29 = (byte)uVar42;
                      uVar42 = vpcmpuq_avx512f(auVar64,auVar65,2);
                      bVar30 = (byte)uVar42;
                      uVar41 = CONCAT11(bVar30,bVar29);
                      auVar57 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                    ((long)pvVar14 +
                                                    uVar51 * 2 +
                                                    lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9
                                                    ));
                      auVar56._2_2_ = (ushort)((byte)(uVar41 >> 1) & 1) * auVar57._2_2_;
                      auVar56._0_2_ = (ushort)(bVar29 & 1) * auVar57._0_2_;
                      auVar56._4_2_ = (ushort)((byte)(uVar41 >> 2) & 1) * auVar57._4_2_;
                      auVar56._6_2_ = (ushort)((byte)(uVar41 >> 3) & 1) * auVar57._6_2_;
                      auVar56._8_2_ = (ushort)((byte)(uVar41 >> 4) & 1) * auVar57._8_2_;
                      auVar56._10_2_ = (ushort)((byte)(uVar41 >> 5) & 1) * auVar57._10_2_;
                      auVar56._12_2_ = (ushort)((byte)(uVar41 >> 6) & 1) * auVar57._12_2_;
                      auVar56._14_2_ = (ushort)((byte)(uVar41 >> 7) & 1) * auVar57._14_2_;
                      auVar56._16_2_ = (ushort)(bVar30 & 1) * auVar57._16_2_;
                      auVar56._18_2_ = (ushort)(bVar30 >> 1 & 1) * auVar57._18_2_;
                      auVar56._20_2_ = (ushort)(bVar30 >> 2 & 1) * auVar57._20_2_;
                      auVar56._22_2_ = (ushort)(bVar30 >> 3 & 1) * auVar57._22_2_;
                      auVar56._24_2_ = (ushort)(bVar30 >> 4 & 1) * auVar57._24_2_;
                      auVar56._26_2_ = (ushort)(bVar30 >> 5 & 1) * auVar57._26_2_;
                      auVar56._28_2_ = (ushort)(bVar30 >> 6 & 1) * auVar57._28_2_;
                      auVar56._30_2_ = (ushort)(bVar30 >> 7) * auVar57._30_2_;
                      auVar63 = vpmovzxwd_avx512f(auVar56);
                      auVar63 = vpslld_avx512f(auVar63,0x10);
                      auVar63 = vmulps_avx512f(auVar63,auVar63);
                      puVar1 = (uint *)((long)pvVar13 +
                                       uVar51 * 4 +
                                       lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12);
                      bVar16 = (bool)((byte)(uVar41 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar41 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar41 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar41 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar41 >> 6) & 1);
                      bVar22 = (bool)((byte)(uVar41 >> 7) & 1);
                      bVar23 = (bool)(bVar30 >> 1 & 1);
                      bVar24 = (bool)(bVar30 >> 2 & 1);
                      bVar25 = (bool)(bVar30 >> 3 & 1);
                      bVar26 = (bool)(bVar30 >> 4 & 1);
                      bVar27 = (bool)(bVar30 >> 5 & 1);
                      bVar28 = (bool)(bVar30 >> 6 & 1);
                      *puVar1 = (uint)(bVar29 & 1) * auVar63._0_4_ |
                                (uint)!(bool)(bVar29 & 1) * *puVar1;
                      puVar1[1] = (uint)bVar16 * auVar63._4_4_ | (uint)!bVar16 * puVar1[1];
                      puVar1[2] = (uint)bVar17 * auVar63._8_4_ | (uint)!bVar17 * puVar1[2];
                      puVar1[3] = (uint)bVar18 * auVar63._12_4_ | (uint)!bVar18 * puVar1[3];
                      puVar1[4] = (uint)bVar19 * auVar63._16_4_ | (uint)!bVar19 * puVar1[4];
                      puVar1[5] = (uint)bVar20 * auVar63._20_4_ | (uint)!bVar20 * puVar1[5];
                      puVar1[6] = (uint)bVar21 * auVar63._24_4_ | (uint)!bVar21 * puVar1[6];
                      puVar1[7] = (uint)bVar22 * auVar63._28_4_ | (uint)!bVar22 * puVar1[7];
                      puVar1[8] = (uint)(bVar30 & 1) * auVar63._32_4_ |
                                  (uint)!(bool)(bVar30 & 1) * puVar1[8];
                      puVar1[9] = (uint)bVar23 * auVar63._36_4_ | (uint)!bVar23 * puVar1[9];
                      puVar1[10] = (uint)bVar24 * auVar63._40_4_ | (uint)!bVar24 * puVar1[10];
                      puVar1[0xb] = (uint)bVar25 * auVar63._44_4_ | (uint)!bVar25 * puVar1[0xb];
                      puVar1[0xc] = (uint)bVar26 * auVar63._48_4_ | (uint)!bVar26 * puVar1[0xc];
                      puVar1[0xd] = (uint)bVar27 * auVar63._52_4_ | (uint)!bVar27 * puVar1[0xd];
                      puVar1[0xe] = (uint)bVar28 * auVar63._56_4_ | (uint)!bVar28 * puVar1[0xe];
                      puVar1[0xf] = (uint)(bVar30 >> 7) * auVar63._60_4_ |
                                    (uint)!(bool)(bVar30 >> 7) * puVar1[0xf];
                      uVar51 = uVar51 + 0x10;
                    } while ((lVar37 + 0xfU & 0xfffffffffffffff0) != uVar51);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
                return;
              }
              goto LAB_0012ef6d;
            }
            goto LAB_0012ef51;
          }
        }
        else {
          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012ea86;
          cVar31 = ggml_is_contiguous_1(pgVar46);
          if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(pgVar43), cVar31 != '\0')) &&
             (cVar31 = ggml_are_same_shape(pgVar46,pgVar43), cVar31 != '\0')) {
            if (pgVar43->nb[0] == 2) {
              if (pgVar46->nb[0] == 2) {
                lVar40 = pgVar46->ne[1];
                lVar53 = pgVar46->ne[2];
                sVar7 = pgVar46->nb[1];
                sVar8 = pgVar46->nb[2];
                sVar9 = pgVar46->nb[3];
                lVar37 = pgVar43->ne[0];
                sVar10 = pgVar43->nb[1];
                sVar11 = pgVar43->nb[2];
                sVar12 = pgVar43->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar33 = ggml_nrows(pgVar46);
                lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
                lVar52 = (int)gVar2 * lVar34;
                lVar34 = lVar34 + lVar52;
                if (lVar33 <= lVar34) {
                  lVar34 = lVar33;
                }
                if (lVar34 <= lVar52) {
                  return;
                }
                lVar53 = lVar53 * lVar40;
                pvVar13 = pgVar43->data;
                pvVar14 = pgVar46->data;
                do {
                  lVar33 = lVar52 / lVar53;
                  lVar39 = lVar52 % lVar53;
                  lVar35 = lVar39 / lVar40;
                  lVar39 = lVar39 % lVar40;
                  if (0 < lVar37) {
                    lVar36 = 0;
                    do {
                      fVar66 = (float)((uint)*(ushort *)
                                              ((long)pvVar14 +
                                              lVar36 * 2 +
                                              lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) <<
                                      0x10);
                      fVar66 = fVar66 * fVar66;
                      if ((uint)ABS(fVar66) < 0x7f800001) {
                        uVar41 = (ushort)((int)fVar66 + 0x7fff + ((uint)fVar66 >> 0x10 & 1) >> 0x10)
                        ;
                      }
                      else {
                        uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar13 +
                       lVar36 * 2 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12) = uVar41;
                      lVar36 = lVar36 + 1;
                    } while (lVar37 != lVar36);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
                return;
              }
              goto LAB_0012ef6d;
            }
            goto LAB_0012ef51;
          }
        }
      }
      else {
LAB_0012ea86:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
          pgVar44 = pgVar46;
          pgVar48 = pgVar43;
          ggml_compute_forward_sqr_cold_1();
          pgVar15 = pgVar44->src[0];
          gVar2 = pgVar15->type;
          pgStack_118 = pgVar15;
          pgStack_110 = pgVar44;
          pgStack_100 = pgVar46;
          pgStack_f8 = pgVar43;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
            pgStack_160 = (ggml_tensor *)0x12f515;
            cVar31 = ggml_is_contiguous_1(pgVar15);
            if (cVar31 != '\0') {
              pgStack_160 = (ggml_tensor *)0x12f525;
              cVar31 = ggml_is_contiguous_1(pgVar44);
              if (cVar31 != '\0') {
                pgStack_160 = (ggml_tensor *)0x12f538;
                cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                if (cVar31 != '\0') {
                  if (pgVar44->nb[0] != 4) goto LAB_0012f851;
                  if (pgVar15->nb[0] == 4) {
                    lStack_150 = pgVar15->ne[1];
                    lStack_158 = pgVar15->ne[2];
                    sStack_120 = pgVar15->nb[1];
                    sStack_128 = pgVar15->nb[2];
                    sStack_130 = pgVar15->nb[3];
                    lVar40 = pgVar44->ne[0];
                    sStack_138 = pgVar44->nb[1];
                    sStack_140 = pgVar44->nb[2];
                    sStack_148 = pgVar44->nb[3];
                    gVar2 = pgVar48->type;
                    iVar3 = *(int *)&pgVar48->field_0x4;
                    pgStack_160 = (ggml_tensor *)0x12f5b0;
                    lVar37 = ggml_nrows(pgVar15);
                    lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                    lVar34 = (int)gVar2 * lVar53;
                    lVar53 = lVar53 + lVar34;
                    if (lVar37 <= lVar53) {
                      lVar53 = lVar37;
                    }
                    if (lVar53 <= lVar34) {
                      return;
                    }
                    lStack_158 = lStack_158 * lStack_150;
                    do {
                      lVar37 = (lVar34 % lStack_158) / lStack_150;
                      lVar33 = (lVar34 % lStack_158) % lStack_150;
                      if (0 < lVar40) {
                        lVar35 = (lVar34 / lStack_158) * sStack_148;
                        lVar39 = lVar37 * sStack_140;
                        lVar36 = lVar33 * sStack_138;
                        lVar52 = (lVar34 / lStack_158) * sStack_130;
                        lVar37 = lVar37 * sStack_128;
                        lVar33 = lVar33 * sStack_120;
                        pvVar13 = pgStack_110->data;
                        pvVar14 = pgStack_118->data;
                        lVar54 = 0;
                        do {
                          fVar66 = *(float *)((long)pvVar14 + lVar54 * 4 + lVar37 + lVar33 + lVar52)
                          ;
                          if (fVar66 < 0.0) {
                            pgStack_160 = (ggml_tensor *)0x12f676;
                            fVar66 = sqrtf(fVar66);
                          }
                          else {
                            auVar69 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
                            fVar66 = auVar69._0_4_;
                          }
                          *(float *)((long)pvVar13 + lVar54 * 4 + lVar39 + lVar36 + lVar35) = fVar66
                          ;
                          lVar54 = lVar54 + 1;
                        } while (lVar40 != lVar54);
                      }
                      lVar34 = lVar34 + 1;
                    } while (lVar34 != lVar53);
                    return;
                  }
LAB_0012f86d:
                  pcVar38 = "nb00 == sizeof(src0_t)";
                  uVar42 = 0x56;
                  goto LAB_0012f887;
                }
              }
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
            pgStack_160 = (ggml_tensor *)0x12efe9;
            cVar31 = ggml_is_contiguous_1(pgVar15);
            if (cVar31 != '\0') {
              pgStack_160 = (ggml_tensor *)0x12eff9;
              cVar31 = ggml_is_contiguous_1(pgVar44);
              if (cVar31 != '\0') {
                pgStack_160 = (ggml_tensor *)0x12f00c;
                cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                if (cVar31 != '\0') {
                  if (pgVar44->nb[0] == 2) {
                    if (pgVar15->nb[0] == 2) {
                      lStack_150 = pgVar15->ne[1];
                      lStack_158 = pgVar15->ne[2];
                      sStack_128 = pgVar15->nb[1];
                      sStack_130 = pgVar15->nb[2];
                      sStack_138 = pgVar15->nb[3];
                      lVar40 = pgVar44->ne[0];
                      sStack_140 = pgVar44->nb[1];
                      sStack_148 = pgVar44->nb[2];
                      sStack_108 = pgVar44->nb[3];
                      gVar2 = pgVar48->type;
                      iVar3 = *(int *)&pgVar48->field_0x4;
                      pgStack_160 = (ggml_tensor *)0x12f084;
                      lVar53 = ggml_nrows(pgVar15);
                      lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                      lVar34 = (int)gVar2 * lVar37;
                      sStack_120 = lVar37 + lVar34;
                      if (lVar53 <= (long)sStack_120) {
                        sStack_120 = lVar53;
                      }
                      if ((long)sStack_120 <= lVar34) {
                        return;
                      }
                      lStack_158 = lStack_158 * lStack_150;
                      do {
                        if (0 < lVar40) {
                          lVar37 = (lVar34 / lStack_158) * sStack_138;
                          lVar53 = ((lVar34 % lStack_158) / lStack_150) * sStack_130;
                          lVar33 = ((lVar34 % lStack_158) % lStack_150) * sStack_128;
                          pvVar13 = pgStack_118->data;
                          lVar52 = 0;
                          do {
                            fVar66 = *(float *)(&ggml_table_f32_f16 +
                                               (ulong)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar52 * 2 + lVar53 + lVar33 + lVar37) * 4);
                            if (fVar66 < 0.0) {
                              pgStack_160 = (ggml_tensor *)0x12f158;
                              auVar64._0_4_ = sqrtf(fVar66);
                              auVar64._4_60_ = extraout_var;
                              auVar69 = auVar64._0_16_;
                            }
                            else {
                              auVar69 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
                            }
                            auVar69 = vcvtps2ph_f16c(auVar69,0);
                            vpextrw_avx(auVar69,0);
                            lVar52 = lVar52 + 1;
                          } while (lVar40 != lVar52);
                        }
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != sStack_120);
                      return;
                    }
                    goto LAB_0012f86d;
                  }
                  goto LAB_0012f851;
                }
              }
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar5 = pgVar44->type;
            in_RCX = (ulong)gVar5;
            if (gVar5 == GGML_TYPE_F32) {
              pgStack_160 = (ggml_tensor *)0x12f6a2;
              cVar31 = ggml_is_contiguous_1(pgVar15);
              if (cVar31 != '\0') {
                pgStack_160 = (ggml_tensor *)0x12f6b2;
                cVar31 = ggml_is_contiguous_1(pgVar44);
                if (cVar31 != '\0') {
                  pgStack_160 = (ggml_tensor *)0x12f6c5;
                  cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                  if (cVar31 != '\0') {
                    if (pgVar44->nb[0] == 4) {
                      if (pgVar15->nb[0] == 2) {
                        lStack_150 = pgVar15->ne[1];
                        lStack_158 = pgVar15->ne[2];
                        sStack_120 = pgVar15->nb[1];
                        sStack_128 = pgVar15->nb[2];
                        sStack_130 = pgVar15->nb[3];
                        lVar40 = pgVar44->ne[0];
                        sStack_138 = pgVar44->nb[1];
                        sStack_140 = pgVar44->nb[2];
                        sStack_148 = pgVar44->nb[3];
                        gVar2 = pgVar48->type;
                        iVar3 = *(int *)&pgVar48->field_0x4;
                        pgStack_160 = (ggml_tensor *)0x12f73d;
                        lVar37 = ggml_nrows(pgVar15);
                        lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                        lVar34 = (int)gVar2 * lVar53;
                        lVar53 = lVar53 + lVar34;
                        if (lVar37 <= lVar53) {
                          lVar53 = lVar37;
                        }
                        if (lVar53 <= lVar34) {
                          return;
                        }
                        lStack_158 = lStack_158 * lStack_150;
                        do {
                          lVar37 = (lVar34 % lStack_158) / lStack_150;
                          lVar33 = (lVar34 % lStack_158) % lStack_150;
                          if (0 < lVar40) {
                            lVar35 = (lVar34 / lStack_158) * sStack_148;
                            lVar36 = lVar37 * sStack_140;
                            lVar54 = lVar33 * sStack_138;
                            lVar52 = (lVar34 / lStack_158) * sStack_130;
                            lVar37 = lVar37 * sStack_128;
                            lVar33 = lVar33 * sStack_120;
                            pvVar13 = pgStack_110->data;
                            pvVar14 = pgStack_118->data;
                            lVar39 = 0;
                            do {
                              uVar41 = *(ushort *)
                                        ((long)pvVar14 + lVar39 * 2 + lVar37 + lVar33 + lVar52);
                              fVar66 = (float)((uint)uVar41 << 0x10);
                              if (fVar66 < 0.0) {
                                pgStack_160 = (ggml_tensor *)0x12f807;
                                fVar66 = sqrtf(fVar66);
                              }
                              else {
                                auVar69 = ZEXT216(uVar41) << 0x10;
                                auVar69 = vsqrtss_avx(auVar69,auVar69);
                                fVar66 = auVar69._0_4_;
                              }
                              *(float *)((long)pvVar13 + lVar39 * 4 + lVar36 + lVar54 + lVar35) =
                                   fVar66;
                              lVar39 = lVar39 + 1;
                            } while (lVar40 != lVar39);
                          }
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != lVar53);
                        return;
                      }
                      goto LAB_0012f86d;
                    }
                    goto LAB_0012f851;
                  }
                }
              }
            }
            else {
              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012f35e;
              pgStack_160 = (ggml_tensor *)0x12f1a9;
              cVar31 = ggml_is_contiguous_1(pgVar15);
              if (cVar31 != '\0') {
                pgStack_160 = (ggml_tensor *)0x12f1b9;
                cVar31 = ggml_is_contiguous_1(pgVar44);
                if (cVar31 != '\0') {
                  pgStack_160 = (ggml_tensor *)0x12f1cc;
                  cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                  if (cVar31 != '\0') {
                    if (pgVar44->nb[0] == 2) {
                      if (pgVar15->nb[0] == 2) {
                        lStack_150 = pgVar15->ne[1];
                        lStack_158 = pgVar15->ne[2];
                        sStack_120 = pgVar15->nb[1];
                        sStack_128 = pgVar15->nb[2];
                        sStack_130 = pgVar15->nb[3];
                        lVar40 = pgVar44->ne[0];
                        sStack_138 = pgVar44->nb[1];
                        sStack_140 = pgVar44->nb[2];
                        sStack_148 = pgVar44->nb[3];
                        gVar2 = pgVar48->type;
                        iVar3 = *(int *)&pgVar48->field_0x4;
                        pgStack_160 = (ggml_tensor *)0x12f244;
                        lVar37 = ggml_nrows(pgVar15);
                        lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                        lVar34 = (int)gVar2 * lVar53;
                        lVar53 = lVar53 + lVar34;
                        if (lVar37 <= lVar53) {
                          lVar53 = lVar37;
                        }
                        if (lVar53 <= lVar34) {
                          return;
                        }
                        lStack_158 = lStack_158 * lStack_150;
                        do {
                          lVar37 = (lVar34 % lStack_158) / lStack_150;
                          lVar33 = (lVar34 % lStack_158) % lStack_150;
                          if (0 < lVar40) {
                            lVar35 = (lVar34 / lStack_158) * sStack_148;
                            lVar36 = lVar37 * sStack_140;
                            lVar39 = lVar33 * sStack_138;
                            lVar52 = (lVar34 / lStack_158) * sStack_130;
                            lVar37 = lVar37 * sStack_128;
                            lVar33 = lVar33 * sStack_120;
                            pvVar13 = pgStack_110->data;
                            pvVar14 = pgStack_118->data;
                            lVar54 = 0;
                            do {
                              uVar41 = *(ushort *)
                                        ((long)pvVar14 + lVar54 * 2 + lVar37 + lVar33 + lVar52);
                              fVar66 = (float)((uint)uVar41 << 0x10);
                              if (fVar66 < 0.0) {
                                pgStack_160 = (ggml_tensor *)0x12f311;
                                fVar66 = sqrtf(fVar66);
                              }
                              else {
                                auVar69 = ZEXT216(uVar41) << 0x10;
                                auVar69 = vsqrtss_avx(auVar69,auVar69);
                                fVar66 = auVar69._0_4_;
                              }
                              if ((uint)ABS(fVar66) < 0x7f800001) {
                                uVar41 = (ushort)((int)fVar66 + 0x7fff + ((uint)fVar66 >> 0x10 & 1)
                                                 >> 0x10);
                              }
                              else {
                                uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                              }
                              *(ushort *)((long)pvVar13 + lVar54 * 2 + lVar36 + lVar39 + lVar35) =
                                   uVar41;
                              lVar54 = lVar54 + 1;
                            } while (lVar40 != lVar54);
                          }
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != lVar53);
                        return;
                      }
                      goto LAB_0012f86d;
                    }
                    goto LAB_0012f851;
                  }
                }
              }
            }
          }
          else {
LAB_0012f35e:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
              pgStack_160 = (ggml_tensor *)ggml_compute_forward_sin;
              pgVar45 = pgVar15;
              pgVar49 = pgVar44;
              ggml_compute_forward_sqrt_cold_1();
              pgVar46 = pgVar45->src[0];
              gVar2 = pgVar46->type;
              pgStack_1a0 = pgVar46;
              pgStack_198 = pgVar45;
              pgStack_188 = pgVar44;
              pgStack_180 = pgVar43;
              pgStack_178 = pgVar15;
              pgStack_170 = pgVar6;
              pgStack_168 = pgVar48;
              pgStack_160 = dst;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar45->type == GGML_TYPE_F32)) {
                pgStack_1e8 = (ggml_tensor *)0x12fdd1;
                cVar31 = ggml_is_contiguous_1(pgVar46);
                if (cVar31 != '\0') {
                  pgStack_1e8 = (ggml_tensor *)0x12fde1;
                  cVar31 = ggml_is_contiguous_1(pgVar45);
                  if (cVar31 != '\0') {
                    pgStack_1e8 = (ggml_tensor *)0x12fdf4;
                    cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                    if (cVar31 != '\0') {
                      if (pgVar45->nb[0] != 4) goto LAB_001300dd;
                      if (pgVar46->nb[0] == 4) {
                        lStack_1d8 = pgVar46->ne[1];
                        lStack_1e0 = pgVar46->ne[2];
                        sStack_1a8 = pgVar46->nb[1];
                        sStack_1b0 = pgVar46->nb[2];
                        sStack_1b8 = pgVar46->nb[3];
                        lVar40 = pgVar45->ne[0];
                        sStack_1c0 = pgVar45->nb[1];
                        sStack_1c8 = pgVar45->nb[2];
                        sStack_1d0 = pgVar45->nb[3];
                        gVar2 = pgVar49->type;
                        iVar3 = *(int *)&pgVar49->field_0x4;
                        pgStack_1e8 = (ggml_tensor *)0x12fe6c;
                        lVar37 = ggml_nrows(pgVar46);
                        lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                        lVar34 = (int)gVar2 * lVar53;
                        lVar53 = lVar53 + lVar34;
                        if (lVar37 <= lVar53) {
                          lVar53 = lVar37;
                        }
                        if (lVar53 <= lVar34) {
                          return;
                        }
                        lStack_1e0 = lStack_1e0 * lStack_1d8;
                        do {
                          lVar37 = (lVar34 % lStack_1e0) / lStack_1d8;
                          lVar33 = (lVar34 % lStack_1e0) % lStack_1d8;
                          if (0 < lVar40) {
                            lVar35 = (lVar34 / lStack_1e0) * sStack_1d0;
                            lVar39 = lVar37 * sStack_1c8;
                            lVar36 = lVar33 * sStack_1c0;
                            lVar52 = (lVar34 / lStack_1e0) * sStack_1b8;
                            lVar37 = lVar37 * sStack_1b0;
                            lVar33 = lVar33 * sStack_1a8;
                            pvVar13 = pgStack_198->data;
                            pvVar14 = pgStack_1a0->data;
                            lVar54 = 0;
                            do {
                              pgStack_1e8 = (ggml_tensor *)0x12ff1e;
                              fVar66 = sinf(*(float *)((long)pvVar14 +
                                                      lVar54 * 4 + lVar37 + lVar33 + lVar52));
                              *(float *)((long)pvVar13 + lVar54 * 4 + lVar39 + lVar36 + lVar35) =
                                   fVar66;
                              lVar54 = lVar54 + 1;
                            } while (lVar40 != lVar54);
                          }
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != lVar53);
                        return;
                      }
LAB_001300f9:
                      pcVar38 = "nb00 == sizeof(src0_t)";
                      uVar42 = 0x56;
                      goto LAB_00130113;
                    }
                  }
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar45->type == GGML_TYPE_F16)) {
                pgStack_1e8 = (ggml_tensor *)0x12f8e9;
                cVar31 = ggml_is_contiguous_1(pgVar46);
                if (cVar31 != '\0') {
                  pgStack_1e8 = (ggml_tensor *)0x12f8f9;
                  cVar31 = ggml_is_contiguous_1(pgVar45);
                  if (cVar31 != '\0') {
                    pgStack_1e8 = (ggml_tensor *)0x12f90c;
                    cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                    if (cVar31 != '\0') {
                      if (pgVar45->nb[0] == 2) {
                        if (pgVar46->nb[0] == 2) {
                          lStack_1d8 = pgVar46->ne[1];
                          lStack_1e0 = pgVar46->ne[2];
                          sStack_1b0 = pgVar46->nb[1];
                          sStack_1b8 = pgVar46->nb[2];
                          sStack_1c0 = pgVar46->nb[3];
                          lVar40 = pgVar45->ne[0];
                          sStack_1c8 = pgVar45->nb[1];
                          sStack_1d0 = pgVar45->nb[2];
                          sStack_190 = pgVar45->nb[3];
                          gVar2 = pgVar49->type;
                          iVar3 = *(int *)&pgVar49->field_0x4;
                          pgStack_1e8 = (ggml_tensor *)0x12f984;
                          lVar53 = ggml_nrows(pgVar46);
                          lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                          lVar34 = (int)gVar2 * lVar37;
                          sStack_1a8 = lVar37 + lVar34;
                          if (lVar53 <= (long)sStack_1a8) {
                            sStack_1a8 = lVar53;
                          }
                          if ((long)sStack_1a8 <= lVar34) {
                            return;
                          }
                          lStack_1e0 = lStack_1e0 * lStack_1d8;
                          do {
                            if (0 < lVar40) {
                              lVar37 = (lVar34 / lStack_1e0) * sStack_1c0;
                              lVar53 = ((lVar34 % lStack_1e0) / lStack_1d8) * sStack_1b8;
                              lVar33 = ((lVar34 % lStack_1e0) % lStack_1d8) * sStack_1b0;
                              pvVar13 = pgStack_1a0->data;
                              lVar52 = 0;
                              do {
                                pgStack_1e8 = (ggml_tensor *)0x12fa44;
                                auVar63._0_4_ =
                                     sinf(*(float *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pvVar13 +
                                                            lVar52 * 2 + lVar53 + lVar33 + lVar37) *
                                                    4));
                                auVar63._4_60_ = extraout_var_00;
                                auVar69 = vcvtps2ph_f16c(auVar63._0_16_,0);
                                vpextrw_avx(auVar69,0);
                                lVar52 = lVar52 + 1;
                              } while (lVar40 != lVar52);
                            }
                            lVar34 = lVar34 + 1;
                          } while (lVar34 != sStack_1a8);
                          return;
                        }
                        goto LAB_001300f9;
                      }
                      goto LAB_001300dd;
                    }
                  }
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar5 = pgVar45->type;
                in_RCX = (ulong)gVar5;
                if (gVar5 == GGML_TYPE_F32) {
                  pgStack_1e8 = (ggml_tensor *)0x12ff46;
                  cVar31 = ggml_is_contiguous_1(pgVar46);
                  if (cVar31 != '\0') {
                    pgStack_1e8 = (ggml_tensor *)0x12ff56;
                    cVar31 = ggml_is_contiguous_1(pgVar45);
                    if (cVar31 != '\0') {
                      pgStack_1e8 = (ggml_tensor *)0x12ff69;
                      cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                      if (cVar31 != '\0') {
                        if (pgVar45->nb[0] == 4) {
                          if (pgVar46->nb[0] == 2) {
                            lStack_1d8 = pgVar46->ne[1];
                            lStack_1e0 = pgVar46->ne[2];
                            sStack_1a8 = pgVar46->nb[1];
                            sStack_1b0 = pgVar46->nb[2];
                            sStack_1b8 = pgVar46->nb[3];
                            lVar40 = pgVar45->ne[0];
                            sStack_1c0 = pgVar45->nb[1];
                            sStack_1c8 = pgVar45->nb[2];
                            sStack_1d0 = pgVar45->nb[3];
                            gVar2 = pgVar49->type;
                            iVar3 = *(int *)&pgVar49->field_0x4;
                            pgStack_1e8 = (ggml_tensor *)0x12ffe1;
                            lVar37 = ggml_nrows(pgVar46);
                            lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                            lVar34 = (int)gVar2 * lVar53;
                            lVar53 = lVar53 + lVar34;
                            if (lVar37 <= lVar53) {
                              lVar53 = lVar37;
                            }
                            if (lVar53 <= lVar34) {
                              return;
                            }
                            lStack_1e0 = lStack_1e0 * lStack_1d8;
                            do {
                              lVar37 = (lVar34 % lStack_1e0) / lStack_1d8;
                              lVar33 = (lVar34 % lStack_1e0) % lStack_1d8;
                              if (0 < lVar40) {
                                lVar35 = (lVar34 / lStack_1e0) * sStack_1d0;
                                lVar36 = lVar37 * sStack_1c8;
                                lVar54 = lVar33 * sStack_1c0;
                                lVar52 = (lVar34 / lStack_1e0) * sStack_1b8;
                                lVar37 = lVar37 * sStack_1b0;
                                lVar33 = lVar33 * sStack_1a8;
                                pvVar13 = pgStack_198->data;
                                pvVar14 = pgStack_1a0->data;
                                lVar39 = 0;
                                do {
                                  pgStack_1e8 = (ggml_tensor *)0x130097;
                                  fVar66 = sinf((float)((uint)*(ushort *)
                                                               ((long)pvVar14 +
                                                               lVar39 * 2 + lVar37 + lVar33 + lVar52
                                                               ) << 0x10));
                                  *(float *)((long)pvVar13 + lVar39 * 4 + lVar36 + lVar54 + lVar35)
                                       = fVar66;
                                  lVar39 = lVar39 + 1;
                                } while (lVar40 != lVar39);
                              }
                              lVar34 = lVar34 + 1;
                            } while (lVar34 != lVar53);
                            return;
                          }
                          goto LAB_001300f9;
                        }
                        goto LAB_001300dd;
                      }
                    }
                  }
                }
                else {
                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012fc32;
                  pgStack_1e8 = (ggml_tensor *)0x12fa91;
                  cVar31 = ggml_is_contiguous_1(pgVar46);
                  if (cVar31 != '\0') {
                    pgStack_1e8 = (ggml_tensor *)0x12faa1;
                    cVar31 = ggml_is_contiguous_1(pgVar45);
                    if (cVar31 != '\0') {
                      pgStack_1e8 = (ggml_tensor *)0x12fab4;
                      cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                      if (cVar31 != '\0') {
                        if (pgVar45->nb[0] == 2) {
                          if (pgVar46->nb[0] == 2) {
                            lStack_1d8 = pgVar46->ne[1];
                            lStack_1e0 = pgVar46->ne[2];
                            sStack_1a8 = pgVar46->nb[1];
                            sStack_1b0 = pgVar46->nb[2];
                            sStack_1b8 = pgVar46->nb[3];
                            lVar40 = pgVar45->ne[0];
                            sStack_1c0 = pgVar45->nb[1];
                            sStack_1c8 = pgVar45->nb[2];
                            sStack_1d0 = pgVar45->nb[3];
                            gVar2 = pgVar49->type;
                            iVar3 = *(int *)&pgVar49->field_0x4;
                            pgStack_1e8 = (ggml_tensor *)0x12fb2c;
                            lVar37 = ggml_nrows(pgVar46);
                            lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                            lVar34 = (int)gVar2 * lVar53;
                            lVar53 = lVar53 + lVar34;
                            if (lVar37 <= lVar53) {
                              lVar53 = lVar37;
                            }
                            if (lVar53 <= lVar34) {
                              return;
                            }
                            lStack_1e0 = lStack_1e0 * lStack_1d8;
                            do {
                              lVar37 = (lVar34 % lStack_1e0) / lStack_1d8;
                              lVar33 = (lVar34 % lStack_1e0) % lStack_1d8;
                              if (0 < lVar40) {
                                lVar35 = (lVar34 / lStack_1e0) * sStack_1d0;
                                lVar36 = lVar37 * sStack_1c8;
                                lVar39 = lVar33 * sStack_1c0;
                                lVar52 = (lVar34 / lStack_1e0) * sStack_1b8;
                                lVar37 = lVar37 * sStack_1b0;
                                lVar33 = lVar33 * sStack_1a8;
                                pvVar13 = pgStack_198->data;
                                pvVar14 = pgStack_1a0->data;
                                lVar54 = 0;
                                do {
                                  pgStack_1e8 = (ggml_tensor *)0x12fbe9;
                                  fVar66 = sinf((float)((uint)*(ushort *)
                                                               ((long)pvVar14 +
                                                               lVar54 * 2 + lVar37 + lVar33 + lVar52
                                                               ) << 0x10));
                                  if ((uint)ABS(fVar66) < 0x7f800001) {
                                    uVar41 = (ushort)((int)fVar66 + 0x7fff +
                                                      ((uint)fVar66 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)((long)pvVar13 + lVar54 * 2 + lVar36 + lVar39 + lVar35)
                                       = uVar41;
                                  lVar54 = lVar54 + 1;
                                } while (lVar40 != lVar54);
                              }
                              lVar34 = lVar34 + 1;
                            } while (lVar34 != lVar53);
                            return;
                          }
                          goto LAB_001300f9;
                        }
                        goto LAB_001300dd;
                      }
                    }
                  }
                }
              }
              else {
LAB_0012fc32:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar45->type != GGML_TYPE_F32)) {
                  pgStack_1e8 = (ggml_tensor *)ggml_compute_forward_cos;
                  pgVar44 = pgVar46;
                  pgVar48 = pgVar45;
                  ggml_compute_forward_sin_cold_1();
                  pgVar15 = pgVar44->src[0];
                  gVar2 = pgVar15->type;
                  pgStack_228 = pgVar15;
                  pgStack_220 = pgVar44;
                  pgStack_210 = pgVar45;
                  pgStack_208 = pgVar43;
                  pgStack_200 = pgVar46;
                  pgStack_1f8 = pgVar6;
                  pgStack_1f0 = pgVar49;
                  pgStack_1e8 = dst;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
                    pgStack_270 = (ggml_tensor *)0x13065d;
                    cVar31 = ggml_is_contiguous_1(pgVar15);
                    if (cVar31 != '\0') {
                      pgStack_270 = (ggml_tensor *)0x13066d;
                      cVar31 = ggml_is_contiguous_1(pgVar44);
                      if (cVar31 != '\0') {
                        pgStack_270 = (ggml_tensor *)0x130680;
                        cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                        if (cVar31 != '\0') {
                          if (pgVar44->nb[0] != 4) goto LAB_00130969;
                          if (pgVar15->nb[0] == 4) {
                            lStack_260 = pgVar15->ne[1];
                            lStack_268 = pgVar15->ne[2];
                            sStack_230 = pgVar15->nb[1];
                            sStack_238 = pgVar15->nb[2];
                            sStack_240 = pgVar15->nb[3];
                            lVar40 = pgVar44->ne[0];
                            sStack_248 = pgVar44->nb[1];
                            sStack_250 = pgVar44->nb[2];
                            sStack_258 = pgVar44->nb[3];
                            gVar2 = pgVar48->type;
                            iVar3 = *(int *)&pgVar48->field_0x4;
                            pgStack_270 = (ggml_tensor *)0x1306f8;
                            lVar37 = ggml_nrows(pgVar15);
                            lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                            lVar34 = (int)gVar2 * lVar53;
                            lVar53 = lVar53 + lVar34;
                            if (lVar37 <= lVar53) {
                              lVar53 = lVar37;
                            }
                            if (lVar53 <= lVar34) {
                              return;
                            }
                            lStack_268 = lStack_268 * lStack_260;
                            do {
                              lVar37 = (lVar34 % lStack_268) / lStack_260;
                              lVar33 = (lVar34 % lStack_268) % lStack_260;
                              if (0 < lVar40) {
                                lVar35 = (lVar34 / lStack_268) * sStack_258;
                                lVar39 = lVar37 * sStack_250;
                                lVar36 = lVar33 * sStack_248;
                                lVar52 = (lVar34 / lStack_268) * sStack_240;
                                lVar37 = lVar37 * sStack_238;
                                lVar33 = lVar33 * sStack_230;
                                pvVar13 = pgStack_220->data;
                                pvVar14 = pgStack_228->data;
                                lVar54 = 0;
                                do {
                                  pgStack_270 = (ggml_tensor *)0x1307aa;
                                  fVar66 = cosf(*(float *)((long)pvVar14 +
                                                          lVar54 * 4 + lVar37 + lVar33 + lVar52));
                                  *(float *)((long)pvVar13 + lVar54 * 4 + lVar39 + lVar36 + lVar35)
                                       = fVar66;
                                  lVar54 = lVar54 + 1;
                                } while (lVar40 != lVar54);
                              }
                              lVar34 = lVar34 + 1;
                            } while (lVar34 != lVar53);
                            return;
                          }
LAB_00130985:
                          pcVar38 = "nb00 == sizeof(src0_t)";
                          uVar42 = 0x56;
                          goto LAB_0013099f;
                        }
                      }
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
                    pgStack_270 = (ggml_tensor *)0x130175;
                    cVar31 = ggml_is_contiguous_1(pgVar15);
                    if (cVar31 != '\0') {
                      pgStack_270 = (ggml_tensor *)0x130185;
                      cVar31 = ggml_is_contiguous_1(pgVar44);
                      if (cVar31 != '\0') {
                        pgStack_270 = (ggml_tensor *)0x130198;
                        cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                        if (cVar31 != '\0') {
                          if (pgVar44->nb[0] == 2) {
                            if (pgVar15->nb[0] == 2) {
                              lStack_260 = pgVar15->ne[1];
                              lStack_268 = pgVar15->ne[2];
                              sStack_238 = pgVar15->nb[1];
                              sStack_240 = pgVar15->nb[2];
                              sStack_248 = pgVar15->nb[3];
                              lVar40 = pgVar44->ne[0];
                              sStack_250 = pgVar44->nb[1];
                              sStack_258 = pgVar44->nb[2];
                              sStack_218 = pgVar44->nb[3];
                              gVar2 = pgVar48->type;
                              iVar3 = *(int *)&pgVar48->field_0x4;
                              pgStack_270 = (ggml_tensor *)0x130210;
                              lVar53 = ggml_nrows(pgVar15);
                              lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                              lVar34 = (int)gVar2 * lVar37;
                              sStack_230 = lVar37 + lVar34;
                              if (lVar53 <= (long)sStack_230) {
                                sStack_230 = lVar53;
                              }
                              if ((long)sStack_230 <= lVar34) {
                                return;
                              }
                              lStack_268 = lStack_268 * lStack_260;
                              do {
                                if (0 < lVar40) {
                                  lVar37 = (lVar34 / lStack_268) * sStack_248;
                                  lVar53 = ((lVar34 % lStack_268) / lStack_260) * sStack_240;
                                  lVar33 = ((lVar34 % lStack_268) % lStack_260) * sStack_238;
                                  pvVar13 = pgStack_228->data;
                                  lVar52 = 0;
                                  do {
                                    pgStack_270 = (ggml_tensor *)0x1302d0;
                                    auVar62._0_4_ =
                                         cosf(*(float *)(&ggml_table_f32_f16 +
                                                        (ulong)*(ushort *)
                                                                ((long)pvVar13 +
                                                                lVar52 * 2 +
                                                                lVar53 + lVar33 + lVar37) * 4));
                                    auVar62._4_60_ = extraout_var_01;
                                    auVar69 = vcvtps2ph_f16c(auVar62._0_16_,0);
                                    vpextrw_avx(auVar69,0);
                                    lVar52 = lVar52 + 1;
                                  } while (lVar40 != lVar52);
                                }
                                lVar34 = lVar34 + 1;
                              } while (lVar34 != sStack_230);
                              return;
                            }
                            goto LAB_00130985;
                          }
                          goto LAB_00130969;
                        }
                      }
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar5 = pgVar44->type;
                    in_RCX = (ulong)gVar5;
                    if (gVar5 == GGML_TYPE_F32) {
                      pgStack_270 = (ggml_tensor *)0x1307d2;
                      cVar31 = ggml_is_contiguous_1(pgVar15);
                      if (cVar31 != '\0') {
                        pgStack_270 = (ggml_tensor *)0x1307e2;
                        cVar31 = ggml_is_contiguous_1(pgVar44);
                        if (cVar31 != '\0') {
                          pgStack_270 = (ggml_tensor *)0x1307f5;
                          cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                          if (cVar31 != '\0') {
                            if (pgVar44->nb[0] == 4) {
                              if (pgVar15->nb[0] == 2) {
                                lStack_260 = pgVar15->ne[1];
                                lStack_268 = pgVar15->ne[2];
                                sStack_230 = pgVar15->nb[1];
                                sStack_238 = pgVar15->nb[2];
                                sStack_240 = pgVar15->nb[3];
                                lVar40 = pgVar44->ne[0];
                                sStack_248 = pgVar44->nb[1];
                                sStack_250 = pgVar44->nb[2];
                                sStack_258 = pgVar44->nb[3];
                                gVar2 = pgVar48->type;
                                iVar3 = *(int *)&pgVar48->field_0x4;
                                pgStack_270 = (ggml_tensor *)0x13086d;
                                lVar37 = ggml_nrows(pgVar15);
                                lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                                lVar34 = (int)gVar2 * lVar53;
                                lVar53 = lVar53 + lVar34;
                                if (lVar37 <= lVar53) {
                                  lVar53 = lVar37;
                                }
                                if (lVar53 <= lVar34) {
                                  return;
                                }
                                lStack_268 = lStack_268 * lStack_260;
                                do {
                                  lVar37 = (lVar34 % lStack_268) / lStack_260;
                                  lVar33 = (lVar34 % lStack_268) % lStack_260;
                                  if (0 < lVar40) {
                                    lVar35 = (lVar34 / lStack_268) * sStack_258;
                                    lVar36 = lVar37 * sStack_250;
                                    lVar54 = lVar33 * sStack_248;
                                    lVar52 = (lVar34 / lStack_268) * sStack_240;
                                    lVar37 = lVar37 * sStack_238;
                                    lVar33 = lVar33 * sStack_230;
                                    pvVar13 = pgStack_220->data;
                                    pvVar14 = pgStack_228->data;
                                    lVar39 = 0;
                                    do {
                                      pgStack_270 = (ggml_tensor *)0x130923;
                                      fVar66 = cosf((float)((uint)*(ushort *)
                                                                   ((long)pvVar14 +
                                                                   lVar39 * 2 +
                                                                   lVar37 + lVar33 + lVar52) << 0x10
                                                           ));
                                      *(float *)((long)pvVar13 +
                                                lVar39 * 4 + lVar36 + lVar54 + lVar35) = fVar66;
                                      lVar39 = lVar39 + 1;
                                    } while (lVar40 != lVar39);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar34 != lVar53);
                                return;
                              }
                              goto LAB_00130985;
                            }
                            goto LAB_00130969;
                          }
                        }
                      }
                    }
                    else {
                      if (gVar5 != GGML_TYPE_BF16) goto LAB_001304be;
                      pgStack_270 = (ggml_tensor *)0x13031d;
                      cVar31 = ggml_is_contiguous_1(pgVar15);
                      if (cVar31 != '\0') {
                        pgStack_270 = (ggml_tensor *)0x13032d;
                        cVar31 = ggml_is_contiguous_1(pgVar44);
                        if (cVar31 != '\0') {
                          pgStack_270 = (ggml_tensor *)0x130340;
                          cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                          if (cVar31 != '\0') {
                            if (pgVar44->nb[0] == 2) {
                              if (pgVar15->nb[0] == 2) {
                                lStack_260 = pgVar15->ne[1];
                                lStack_268 = pgVar15->ne[2];
                                sStack_230 = pgVar15->nb[1];
                                sStack_238 = pgVar15->nb[2];
                                sStack_240 = pgVar15->nb[3];
                                lVar40 = pgVar44->ne[0];
                                sStack_248 = pgVar44->nb[1];
                                sStack_250 = pgVar44->nb[2];
                                sStack_258 = pgVar44->nb[3];
                                gVar2 = pgVar48->type;
                                iVar3 = *(int *)&pgVar48->field_0x4;
                                pgStack_270 = (ggml_tensor *)0x1303b8;
                                lVar37 = ggml_nrows(pgVar15);
                                lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                                lVar34 = (int)gVar2 * lVar53;
                                lVar53 = lVar53 + lVar34;
                                if (lVar37 <= lVar53) {
                                  lVar53 = lVar37;
                                }
                                if (lVar53 <= lVar34) {
                                  return;
                                }
                                lStack_268 = lStack_268 * lStack_260;
                                do {
                                  lVar37 = (lVar34 % lStack_268) / lStack_260;
                                  lVar33 = (lVar34 % lStack_268) % lStack_260;
                                  if (0 < lVar40) {
                                    lVar35 = (lVar34 / lStack_268) * sStack_258;
                                    lVar36 = lVar37 * sStack_250;
                                    lVar39 = lVar33 * sStack_248;
                                    lVar52 = (lVar34 / lStack_268) * sStack_240;
                                    lVar37 = lVar37 * sStack_238;
                                    lVar33 = lVar33 * sStack_230;
                                    pvVar13 = pgStack_220->data;
                                    pvVar14 = pgStack_228->data;
                                    lVar54 = 0;
                                    do {
                                      pgStack_270 = (ggml_tensor *)0x130475;
                                      fVar66 = cosf((float)((uint)*(ushort *)
                                                                   ((long)pvVar14 +
                                                                   lVar54 * 2 +
                                                                   lVar37 + lVar33 + lVar52) << 0x10
                                                           ));
                                      if ((uint)ABS(fVar66) < 0x7f800001) {
                                        uVar41 = (ushort)((int)fVar66 + 0x7fff +
                                                          ((uint)fVar66 >> 0x10 & 1) >> 0x10);
                                      }
                                      else {
                                        uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                                      }
                                      *(ushort *)
                                       ((long)pvVar13 + lVar54 * 2 + lVar36 + lVar39 + lVar35) =
                                           uVar41;
                                      lVar54 = lVar54 + 1;
                                    } while (lVar40 != lVar54);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar34 != lVar53);
                                return;
                              }
                              goto LAB_00130985;
                            }
                            goto LAB_00130969;
                          }
                        }
                      }
                    }
                  }
                  else {
LAB_001304be:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
                      pgStack_270 = (ggml_tensor *)ggml_compute_forward_log;
                      pgVar45 = pgVar15;
                      pgVar49 = pgVar44;
                      ggml_compute_forward_cos_cold_1();
                      pgVar46 = pgVar45->src[0];
                      gVar2 = pgVar46->type;
                      pgStack_2b0 = pgVar46;
                      pgStack_2a8 = pgVar45;
                      pgStack_298 = pgVar44;
                      pgStack_290 = pgVar43;
                      pgStack_288 = pgVar15;
                      pgStack_280 = pgVar6;
                      pgStack_278 = pgVar48;
                      pgStack_270 = dst;
                      if ((gVar2 == GGML_TYPE_F32) && (pgVar45->type == GGML_TYPE_F32)) {
                        pgStack_2f8 = (ggml_tensor *)0x130ee9;
                        cVar31 = ggml_is_contiguous_1(pgVar46);
                        if (cVar31 != '\0') {
                          pgStack_2f8 = (ggml_tensor *)0x130ef9;
                          cVar31 = ggml_is_contiguous_1(pgVar45);
                          if (cVar31 != '\0') {
                            pgStack_2f8 = (ggml_tensor *)0x130f0c;
                            cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                            if (cVar31 != '\0') {
                              if (pgVar45->nb[0] != 4) goto LAB_001311f5;
                              if (pgVar46->nb[0] == 4) {
                                lStack_2e8 = pgVar46->ne[1];
                                lStack_2f0 = pgVar46->ne[2];
                                sStack_2b8 = pgVar46->nb[1];
                                sStack_2c0 = pgVar46->nb[2];
                                sStack_2c8 = pgVar46->nb[3];
                                lVar40 = pgVar45->ne[0];
                                sStack_2d0 = pgVar45->nb[1];
                                sStack_2d8 = pgVar45->nb[2];
                                sStack_2e0 = pgVar45->nb[3];
                                gVar2 = pgVar49->type;
                                iVar3 = *(int *)&pgVar49->field_0x4;
                                pgStack_2f8 = (ggml_tensor *)0x130f84;
                                lVar37 = ggml_nrows(pgVar46);
                                lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                                lVar34 = (int)gVar2 * lVar53;
                                lVar53 = lVar53 + lVar34;
                                if (lVar37 <= lVar53) {
                                  lVar53 = lVar37;
                                }
                                if (lVar53 <= lVar34) {
                                  return;
                                }
                                lStack_2f0 = lStack_2f0 * lStack_2e8;
                                do {
                                  lVar37 = (lVar34 % lStack_2f0) / lStack_2e8;
                                  lVar33 = (lVar34 % lStack_2f0) % lStack_2e8;
                                  if (0 < lVar40) {
                                    lVar35 = (lVar34 / lStack_2f0) * sStack_2e0;
                                    lVar39 = lVar37 * sStack_2d8;
                                    lVar36 = lVar33 * sStack_2d0;
                                    lVar52 = (lVar34 / lStack_2f0) * sStack_2c8;
                                    lVar37 = lVar37 * sStack_2c0;
                                    lVar33 = lVar33 * sStack_2b8;
                                    pvVar13 = pgStack_2a8->data;
                                    pvVar14 = pgStack_2b0->data;
                                    lVar54 = 0;
                                    do {
                                      pgStack_2f8 = (ggml_tensor *)0x131036;
                                      fVar66 = logf(*(float *)((long)pvVar14 +
                                                              lVar54 * 4 + lVar37 + lVar33 + lVar52)
                                                   );
                                      *(float *)((long)pvVar13 +
                                                lVar54 * 4 + lVar39 + lVar36 + lVar35) = fVar66;
                                      lVar54 = lVar54 + 1;
                                    } while (lVar40 != lVar54);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar34 != lVar53);
                                return;
                              }
LAB_00131211:
                              pcVar38 = "nb00 == sizeof(src0_t)";
                              uVar42 = 0x56;
                              goto LAB_0013122b;
                            }
                          }
                        }
                      }
                      else if ((gVar2 == GGML_TYPE_F16) && (pgVar45->type == GGML_TYPE_F16)) {
                        pgStack_2f8 = (ggml_tensor *)0x130a01;
                        cVar31 = ggml_is_contiguous_1(pgVar46);
                        if (cVar31 != '\0') {
                          pgStack_2f8 = (ggml_tensor *)0x130a11;
                          cVar31 = ggml_is_contiguous_1(pgVar45);
                          if (cVar31 != '\0') {
                            pgStack_2f8 = (ggml_tensor *)0x130a24;
                            cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                            if (cVar31 != '\0') {
                              if (pgVar45->nb[0] == 2) {
                                if (pgVar46->nb[0] == 2) {
                                  lStack_2e8 = pgVar46->ne[1];
                                  lStack_2f0 = pgVar46->ne[2];
                                  sStack_2c0 = pgVar46->nb[1];
                                  sStack_2c8 = pgVar46->nb[2];
                                  sStack_2d0 = pgVar46->nb[3];
                                  lVar40 = pgVar45->ne[0];
                                  sStack_2d8 = pgVar45->nb[1];
                                  sStack_2e0 = pgVar45->nb[2];
                                  sStack_2a0 = pgVar45->nb[3];
                                  gVar2 = pgVar49->type;
                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                  pgStack_2f8 = (ggml_tensor *)0x130a9c;
                                  lVar53 = ggml_nrows(pgVar46);
                                  lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                                  lVar34 = (int)gVar2 * lVar37;
                                  sStack_2b8 = lVar37 + lVar34;
                                  if (lVar53 <= (long)sStack_2b8) {
                                    sStack_2b8 = lVar53;
                                  }
                                  if ((long)sStack_2b8 <= lVar34) {
                                    return;
                                  }
                                  lStack_2f0 = lStack_2f0 * lStack_2e8;
                                  do {
                                    if (0 < lVar40) {
                                      lVar37 = (lVar34 / lStack_2f0) * sStack_2d0;
                                      lVar53 = ((lVar34 % lStack_2f0) / lStack_2e8) * sStack_2c8;
                                      lVar33 = ((lVar34 % lStack_2f0) % lStack_2e8) * sStack_2c0;
                                      pvVar13 = pgStack_2b0->data;
                                      lVar52 = 0;
                                      do {
                                        pgStack_2f8 = (ggml_tensor *)0x130b5c;
                                        auVar61._0_4_ =
                                             logf(*(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pvVar13 +
                                                                    lVar52 * 2 +
                                                                    lVar53 + lVar33 + lVar37) * 4));
                                        auVar61._4_60_ = extraout_var_02;
                                        auVar69 = vcvtps2ph_f16c(auVar61._0_16_,0);
                                        vpextrw_avx(auVar69,0);
                                        lVar52 = lVar52 + 1;
                                      } while (lVar40 != lVar52);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar34 != sStack_2b8);
                                  return;
                                }
                                goto LAB_00131211;
                              }
                              goto LAB_001311f5;
                            }
                          }
                        }
                      }
                      else if (gVar2 == GGML_TYPE_BF16) {
                        gVar5 = pgVar45->type;
                        in_RCX = (ulong)gVar5;
                        if (gVar5 == GGML_TYPE_F32) {
                          pgStack_2f8 = (ggml_tensor *)0x13105e;
                          cVar31 = ggml_is_contiguous_1(pgVar46);
                          if (cVar31 != '\0') {
                            pgStack_2f8 = (ggml_tensor *)0x13106e;
                            cVar31 = ggml_is_contiguous_1(pgVar45);
                            if (cVar31 != '\0') {
                              pgStack_2f8 = (ggml_tensor *)0x131081;
                              cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                              if (cVar31 != '\0') {
                                if (pgVar45->nb[0] == 4) {
                                  if (pgVar46->nb[0] == 2) {
                                    lStack_2e8 = pgVar46->ne[1];
                                    lStack_2f0 = pgVar46->ne[2];
                                    sStack_2b8 = pgVar46->nb[1];
                                    sStack_2c0 = pgVar46->nb[2];
                                    sStack_2c8 = pgVar46->nb[3];
                                    lVar40 = pgVar45->ne[0];
                                    sStack_2d0 = pgVar45->nb[1];
                                    sStack_2d8 = pgVar45->nb[2];
                                    sStack_2e0 = pgVar45->nb[3];
                                    gVar2 = pgVar49->type;
                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                    pgStack_2f8 = (ggml_tensor *)0x1310f9;
                                    lVar37 = ggml_nrows(pgVar46);
                                    lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                                    lVar34 = (int)gVar2 * lVar53;
                                    lVar53 = lVar53 + lVar34;
                                    if (lVar37 <= lVar53) {
                                      lVar53 = lVar37;
                                    }
                                    if (lVar53 <= lVar34) {
                                      return;
                                    }
                                    lStack_2f0 = lStack_2f0 * lStack_2e8;
                                    do {
                                      lVar37 = (lVar34 % lStack_2f0) / lStack_2e8;
                                      lVar33 = (lVar34 % lStack_2f0) % lStack_2e8;
                                      if (0 < lVar40) {
                                        lVar35 = (lVar34 / lStack_2f0) * sStack_2e0;
                                        lVar36 = lVar37 * sStack_2d8;
                                        lVar54 = lVar33 * sStack_2d0;
                                        lVar52 = (lVar34 / lStack_2f0) * sStack_2c8;
                                        lVar37 = lVar37 * sStack_2c0;
                                        lVar33 = lVar33 * sStack_2b8;
                                        pvVar13 = pgStack_2a8->data;
                                        pvVar14 = pgStack_2b0->data;
                                        lVar39 = 0;
                                        do {
                                          pgStack_2f8 = (ggml_tensor *)0x1311af;
                                          fVar66 = logf((float)((uint)*(ushort *)
                                                                       ((long)pvVar14 +
                                                                       lVar39 * 2 +
                                                                       lVar37 + lVar33 + lVar52) <<
                                                               0x10));
                                          *(float *)((long)pvVar13 +
                                                    lVar39 * 4 + lVar36 + lVar54 + lVar35) = fVar66;
                                          lVar39 = lVar39 + 1;
                                        } while (lVar40 != lVar39);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != lVar53);
                                    return;
                                  }
                                  goto LAB_00131211;
                                }
                                goto LAB_001311f5;
                              }
                            }
                          }
                        }
                        else {
                          if (gVar5 != GGML_TYPE_BF16) goto LAB_00130d4a;
                          pgStack_2f8 = (ggml_tensor *)0x130ba9;
                          cVar31 = ggml_is_contiguous_1(pgVar46);
                          if (cVar31 != '\0') {
                            pgStack_2f8 = (ggml_tensor *)0x130bb9;
                            cVar31 = ggml_is_contiguous_1(pgVar45);
                            if (cVar31 != '\0') {
                              pgStack_2f8 = (ggml_tensor *)0x130bcc;
                              cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                              if (cVar31 != '\0') {
                                if (pgVar45->nb[0] == 2) {
                                  if (pgVar46->nb[0] == 2) {
                                    lStack_2e8 = pgVar46->ne[1];
                                    lStack_2f0 = pgVar46->ne[2];
                                    sStack_2b8 = pgVar46->nb[1];
                                    sStack_2c0 = pgVar46->nb[2];
                                    sStack_2c8 = pgVar46->nb[3];
                                    lVar40 = pgVar45->ne[0];
                                    sStack_2d0 = pgVar45->nb[1];
                                    sStack_2d8 = pgVar45->nb[2];
                                    sStack_2e0 = pgVar45->nb[3];
                                    gVar2 = pgVar49->type;
                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                    pgStack_2f8 = (ggml_tensor *)0x130c44;
                                    lVar37 = ggml_nrows(pgVar46);
                                    lVar53 = ((long)iVar3 + -1 + lVar37) / (long)iVar3;
                                    lVar34 = (int)gVar2 * lVar53;
                                    lVar53 = lVar53 + lVar34;
                                    if (lVar37 <= lVar53) {
                                      lVar53 = lVar37;
                                    }
                                    if (lVar53 <= lVar34) {
                                      return;
                                    }
                                    lStack_2f0 = lStack_2f0 * lStack_2e8;
                                    do {
                                      lVar37 = (lVar34 % lStack_2f0) / lStack_2e8;
                                      lVar33 = (lVar34 % lStack_2f0) % lStack_2e8;
                                      if (0 < lVar40) {
                                        lVar35 = (lVar34 / lStack_2f0) * sStack_2e0;
                                        lVar36 = lVar37 * sStack_2d8;
                                        lVar39 = lVar33 * sStack_2d0;
                                        lVar52 = (lVar34 / lStack_2f0) * sStack_2c8;
                                        lVar37 = lVar37 * sStack_2c0;
                                        lVar33 = lVar33 * sStack_2b8;
                                        pvVar13 = pgStack_2a8->data;
                                        pvVar14 = pgStack_2b0->data;
                                        lVar54 = 0;
                                        do {
                                          pgStack_2f8 = (ggml_tensor *)0x130d01;
                                          fVar66 = logf((float)((uint)*(ushort *)
                                                                       ((long)pvVar14 +
                                                                       lVar54 * 2 +
                                                                       lVar37 + lVar33 + lVar52) <<
                                                               0x10));
                                          if ((uint)ABS(fVar66) < 0x7f800001) {
                                            uVar41 = (ushort)((int)fVar66 + 0x7fff +
                                                              ((uint)fVar66 >> 0x10 & 1) >> 0x10);
                                          }
                                          else {
                                            uVar41 = (ushort)((uint)fVar66 >> 0x10) | 0x40;
                                          }
                                          *(ushort *)
                                           ((long)pvVar13 + lVar54 * 2 + lVar36 + lVar39 + lVar35) =
                                               uVar41;
                                          lVar54 = lVar54 + 1;
                                        } while (lVar40 != lVar54);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != lVar53);
                                    return;
                                  }
                                  goto LAB_00131211;
                                }
                                goto LAB_001311f5;
                              }
                            }
                          }
                        }
                      }
                      else {
LAB_00130d4a:
                        if ((gVar2 != GGML_TYPE_F16) || (pgVar45->type != GGML_TYPE_F32)) {
                          pgStack_2f8 = (ggml_tensor *)0x13123d;
                          pgVar43 = pgVar45;
                          ggml_compute_forward_log_cold_1();
                          pgStack_2f8 = dst;
                          pgStack_300 = pgVar6;
                          pgStack_308 = pgVar45;
                          uVar47 = (uint)pgVar43;
                          uVar32 = uVar47 & 0xffffffc0;
                          uStack_3c0 = 0;
                          uStack_3b8 = 0;
                          uStack_3b0 = 0;
                          uStack_3a8 = 0;
                          uStack_3a0 = 0;
                          uStack_398 = 0;
                          uStack_390 = 0;
                          uStack_388 = 0;
                          uStack_400 = 0;
                          uStack_3f8 = 0;
                          uStack_3f0 = 0;
                          uStack_3e8 = 0;
                          uStack_3e0 = 0;
                          uStack_3d8 = 0;
                          uStack_3d0 = 0;
                          uStack_3c8 = 0;
                          uStack_440 = 0;
                          uStack_438 = 0;
                          uStack_430 = 0;
                          uStack_428 = 0;
                          uStack_420 = 0;
                          uStack_418 = 0;
                          uStack_410 = 0;
                          uStack_408 = 0;
                          auStack_480 = ZEXT1664(ZEXT816(0));
                          if (0 < (int)uVar32) {
                            uVar50 = 0;
                            lVar40 = in_R9;
                            uVar51 = in_RCX;
                            do {
                              lVar53 = 0;
                              do {
                                auVar65 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                               (lVar40 + lVar53),
                                                              *(undefined1 (*) [64])
                                                               (uVar51 + lVar53),
                                                              *(undefined1 (*) [64])
                                                               (auStack_480 + lVar53));
                                *(undefined1 (*) [64])(auStack_480 + lVar53) = auVar65;
                                lVar53 = lVar53 + 0x40;
                              } while (lVar53 != 0x100);
                              uVar50 = uVar50 + 0x40;
                              lVar40 = lVar40 + 0x100;
                              uVar51 = uVar51 + 0x100;
                            } while (uVar50 < uVar32);
                          }
                          lVar40 = 0;
                          do {
                            auVar65 = vaddps_avx512f(*(undefined1 (*) [64])(auStack_480 + lVar40),
                                                     *(undefined1 (*) [64])
                                                      ((long)&uStack_400 + lVar40));
                            *(undefined1 (*) [64])(auStack_480 + lVar40) = auVar65;
                            lVar40 = lVar40 + 0x40;
                          } while (lVar40 == 0x40);
                          auVar65._8_8_ = uStack_438;
                          auVar65._0_8_ = uStack_440;
                          auVar65._16_8_ = uStack_430;
                          auVar65._24_8_ = uStack_428;
                          auVar65._32_8_ = uStack_420;
                          auVar65._40_8_ = uStack_418;
                          auVar65._48_8_ = uStack_410;
                          auVar65._56_8_ = uStack_408;
                          auVar65 = vaddps_avx512f(auStack_480,auVar65);
                          auVar57 = vextractf64x4_avx512f(auVar65,1);
                          auVar65 = vaddps_avx512f(auVar65,ZEXT3264(auVar57));
                          auVar67._0_4_ = auVar65._0_4_ + auVar65._16_4_;
                          auVar67._4_4_ = auVar65._4_4_ + auVar65._20_4_;
                          auVar67._8_4_ = auVar65._8_4_ + auVar65._24_4_;
                          auVar67._12_4_ = auVar65._12_4_ + auVar65._28_4_;
                          auVar69 = vshufpd_avx(auVar67,auVar67,1);
                          auVar68._0_4_ = auVar67._0_4_ + auVar69._0_4_;
                          auVar68._4_4_ = auVar67._4_4_ + auVar69._4_4_;
                          auVar68._8_4_ = auVar67._8_4_ + auVar69._8_4_;
                          auVar68._12_4_ = auVar67._12_4_ + auVar69._12_4_;
                          auVar69 = vhaddps_avx(auVar68,auVar68);
                          auVar65 = ZEXT1664(auVar69);
                          if (uVar32 != uVar47) {
                            lVar40 = (long)(int)uVar32;
                            do {
                              auVar69 = vfmadd231ss_fma(auVar65._0_16_,
                                                        ZEXT416(*(uint *)(in_RCX + lVar40 * 4)),
                                                        ZEXT416(*(uint *)(in_R9 + lVar40 * 4)));
                              auVar65 = ZEXT1664(auVar69);
                              lVar40 = lVar40 + 1;
                            } while (lVar40 < (int)uVar47);
                          }
                          pgVar46->type = auVar65._0_4_;
                          return;
                        }
                        pgStack_2f8 = (ggml_tensor *)0x130d64;
                        cVar31 = ggml_is_contiguous_1(pgVar46);
                        if (cVar31 != '\0') {
                          pgStack_2f8 = (ggml_tensor *)0x130d74;
                          cVar31 = ggml_is_contiguous_1(pgVar45);
                          if (cVar31 != '\0') {
                            pgStack_2f8 = (ggml_tensor *)0x130d87;
                            cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                            if (cVar31 != '\0') {
                              if (pgVar45->nb[0] == 4) {
                                if (pgVar46->nb[0] == 2) {
                                  lStack_2e8 = pgVar46->ne[1];
                                  lStack_2f0 = pgVar46->ne[2];
                                  sStack_2c0 = pgVar46->nb[1];
                                  sStack_2c8 = pgVar46->nb[2];
                                  sStack_2d0 = pgVar46->nb[3];
                                  lVar40 = pgVar45->ne[0];
                                  sStack_2d8 = pgVar45->nb[1];
                                  sStack_2e0 = pgVar45->nb[2];
                                  sStack_2a0 = pgVar45->nb[3];
                                  gVar2 = pgVar49->type;
                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                  pgStack_2f8 = (ggml_tensor *)0x130dff;
                                  lVar53 = ggml_nrows(pgVar46);
                                  lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                                  lVar34 = (int)gVar2 * lVar37;
                                  sStack_2b8 = lVar37 + lVar34;
                                  if (lVar53 <= (long)sStack_2b8) {
                                    sStack_2b8 = lVar53;
                                  }
                                  if (lVar34 < (long)sStack_2b8) {
                                    lStack_2f0 = lStack_2f0 * lStack_2e8;
                                    do {
                                      lVar53 = (lVar34 % lStack_2f0) / lStack_2e8;
                                      lVar37 = (lVar34 % lStack_2f0) % lStack_2e8;
                                      if (0 < lVar40) {
                                        lVar52 = (lVar34 / lStack_2f0) * sStack_2a0;
                                        lVar35 = lVar53 * sStack_2e0;
                                        lVar39 = lVar37 * sStack_2d8;
                                        lVar33 = (lVar34 / lStack_2f0) * sStack_2d0;
                                        lVar53 = lVar53 * sStack_2c8;
                                        lVar37 = lVar37 * sStack_2c0;
                                        pvVar13 = pgStack_2a8->data;
                                        pvVar14 = pgStack_2b0->data;
                                        lVar36 = 0;
                                        do {
                                          pgStack_2f8 = (ggml_tensor *)0x130ebf;
                                          fVar66 = logf(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pvVar14 +
                                                                          lVar36 * 2 +
                                                                          lVar53 + lVar37 + lVar33)
                                                                  * 4));
                                          *(float *)((long)pvVar13 +
                                                    lVar36 * 4 + lVar35 + lVar39 + lVar52) = fVar66;
                                          lVar36 = lVar36 + 1;
                                        } while (lVar40 != lVar36);
                                      }
                                      lVar34 = lVar34 + 1;
                                    } while (lVar34 != sStack_2b8);
                                  }
                                  return;
                                }
                                goto LAB_00131211;
                              }
LAB_001311f5:
                              pcVar38 = "nb0 == sizeof(dst_t)";
                              uVar42 = 0x55;
                              goto LAB_0013122b;
                            }
                          }
                        }
                      }
                      pcVar38 = 
                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                      ;
                      uVar42 = 0x51;
LAB_0013122b:
                      pgStack_2f8 = (ggml_tensor *)0x131232;
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                 ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
                    }
                    pgStack_270 = (ggml_tensor *)0x1304d8;
                    cVar31 = ggml_is_contiguous_1(pgVar15);
                    if (cVar31 != '\0') {
                      pgStack_270 = (ggml_tensor *)0x1304e8;
                      cVar31 = ggml_is_contiguous_1(pgVar44);
                      if (cVar31 != '\0') {
                        pgStack_270 = (ggml_tensor *)0x1304fb;
                        cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                        if (cVar31 != '\0') {
                          if (pgVar44->nb[0] == 4) {
                            if (pgVar15->nb[0] == 2) {
                              lStack_260 = pgVar15->ne[1];
                              lStack_268 = pgVar15->ne[2];
                              sStack_238 = pgVar15->nb[1];
                              sStack_240 = pgVar15->nb[2];
                              sStack_248 = pgVar15->nb[3];
                              lVar40 = pgVar44->ne[0];
                              sStack_250 = pgVar44->nb[1];
                              sStack_258 = pgVar44->nb[2];
                              sStack_218 = pgVar44->nb[3];
                              gVar2 = pgVar48->type;
                              iVar3 = *(int *)&pgVar48->field_0x4;
                              pgStack_270 = (ggml_tensor *)0x130573;
                              lVar53 = ggml_nrows(pgVar15);
                              lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                              lVar34 = (int)gVar2 * lVar37;
                              sStack_230 = lVar37 + lVar34;
                              if (lVar53 <= (long)sStack_230) {
                                sStack_230 = lVar53;
                              }
                              if (lVar34 < (long)sStack_230) {
                                lStack_268 = lStack_268 * lStack_260;
                                do {
                                  lVar53 = (lVar34 % lStack_268) / lStack_260;
                                  lVar37 = (lVar34 % lStack_268) % lStack_260;
                                  if (0 < lVar40) {
                                    lVar52 = (lVar34 / lStack_268) * sStack_218;
                                    lVar35 = lVar53 * sStack_258;
                                    lVar39 = lVar37 * sStack_250;
                                    lVar33 = (lVar34 / lStack_268) * sStack_248;
                                    lVar53 = lVar53 * sStack_240;
                                    lVar37 = lVar37 * sStack_238;
                                    pvVar13 = pgStack_220->data;
                                    pvVar14 = pgStack_228->data;
                                    lVar36 = 0;
                                    do {
                                      pgStack_270 = (ggml_tensor *)0x130633;
                                      fVar66 = cosf(*(float *)(&ggml_table_f32_f16 +
                                                              (ulong)*(ushort *)
                                                                      ((long)pvVar14 +
                                                                      lVar36 * 2 +
                                                                      lVar53 + lVar37 + lVar33) * 4)
                                                   );
                                      *(float *)((long)pvVar13 +
                                                lVar36 * 4 + lVar35 + lVar39 + lVar52) = fVar66;
                                      lVar36 = lVar36 + 1;
                                    } while (lVar40 != lVar36);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar34 != sStack_230);
                              }
                              return;
                            }
                            goto LAB_00130985;
                          }
LAB_00130969:
                          pcVar38 = "nb0 == sizeof(dst_t)";
                          uVar42 = 0x55;
                          goto LAB_0013099f;
                        }
                      }
                    }
                  }
                  pcVar38 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar42 = 0x51;
LAB_0013099f:
                  pgStack_270 = (ggml_tensor *)0x1309a6;
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
                }
                pgStack_1e8 = (ggml_tensor *)0x12fc4c;
                cVar31 = ggml_is_contiguous_1(pgVar46);
                if (cVar31 != '\0') {
                  pgStack_1e8 = (ggml_tensor *)0x12fc5c;
                  cVar31 = ggml_is_contiguous_1(pgVar45);
                  if (cVar31 != '\0') {
                    pgStack_1e8 = (ggml_tensor *)0x12fc6f;
                    cVar31 = ggml_are_same_shape(pgVar46,pgVar45);
                    if (cVar31 != '\0') {
                      if (pgVar45->nb[0] == 4) {
                        if (pgVar46->nb[0] == 2) {
                          lStack_1d8 = pgVar46->ne[1];
                          lStack_1e0 = pgVar46->ne[2];
                          sStack_1b0 = pgVar46->nb[1];
                          sStack_1b8 = pgVar46->nb[2];
                          sStack_1c0 = pgVar46->nb[3];
                          lVar40 = pgVar45->ne[0];
                          sStack_1c8 = pgVar45->nb[1];
                          sStack_1d0 = pgVar45->nb[2];
                          sStack_190 = pgVar45->nb[3];
                          gVar2 = pgVar49->type;
                          iVar3 = *(int *)&pgVar49->field_0x4;
                          pgStack_1e8 = (ggml_tensor *)0x12fce7;
                          lVar53 = ggml_nrows(pgVar46);
                          lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                          lVar34 = (int)gVar2 * lVar37;
                          sStack_1a8 = lVar37 + lVar34;
                          if (lVar53 <= (long)sStack_1a8) {
                            sStack_1a8 = lVar53;
                          }
                          if (lVar34 < (long)sStack_1a8) {
                            lStack_1e0 = lStack_1e0 * lStack_1d8;
                            do {
                              lVar53 = (lVar34 % lStack_1e0) / lStack_1d8;
                              lVar37 = (lVar34 % lStack_1e0) % lStack_1d8;
                              if (0 < lVar40) {
                                lVar52 = (lVar34 / lStack_1e0) * sStack_190;
                                lVar35 = lVar53 * sStack_1d0;
                                lVar39 = lVar37 * sStack_1c8;
                                lVar33 = (lVar34 / lStack_1e0) * sStack_1c0;
                                lVar53 = lVar53 * sStack_1b8;
                                lVar37 = lVar37 * sStack_1b0;
                                pvVar13 = pgStack_198->data;
                                pvVar14 = pgStack_1a0->data;
                                lVar36 = 0;
                                do {
                                  pgStack_1e8 = (ggml_tensor *)0x12fda7;
                                  fVar66 = sinf(*(float *)(&ggml_table_f32_f16 +
                                                          (ulong)*(ushort *)
                                                                  ((long)pvVar14 +
                                                                  lVar36 * 2 +
                                                                  lVar53 + lVar37 + lVar33) * 4));
                                  *(float *)((long)pvVar13 + lVar36 * 4 + lVar35 + lVar39 + lVar52)
                                       = fVar66;
                                  lVar36 = lVar36 + 1;
                                } while (lVar40 != lVar36);
                              }
                              lVar34 = lVar34 + 1;
                            } while (lVar34 != sStack_1a8);
                          }
                          return;
                        }
                        goto LAB_001300f9;
                      }
LAB_001300dd:
                      pcVar38 = "nb0 == sizeof(dst_t)";
                      uVar42 = 0x55;
                      goto LAB_00130113;
                    }
                  }
                }
              }
              pcVar38 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar42 = 0x51;
LAB_00130113:
              pgStack_1e8 = (ggml_tensor *)0x13011a;
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
            }
            pgStack_160 = (ggml_tensor *)0x12f378;
            cVar31 = ggml_is_contiguous_1(pgVar15);
            if (cVar31 != '\0') {
              pgStack_160 = (ggml_tensor *)0x12f388;
              cVar31 = ggml_is_contiguous_1(pgVar44);
              if (cVar31 != '\0') {
                pgStack_160 = (ggml_tensor *)0x12f39b;
                cVar31 = ggml_are_same_shape(pgVar15,pgVar44);
                if (cVar31 != '\0') {
                  if (pgVar44->nb[0] == 4) {
                    if (pgVar15->nb[0] == 2) {
                      lStack_150 = pgVar15->ne[1];
                      lStack_158 = pgVar15->ne[2];
                      sStack_128 = pgVar15->nb[1];
                      sStack_130 = pgVar15->nb[2];
                      sStack_138 = pgVar15->nb[3];
                      lVar40 = pgVar44->ne[0];
                      sStack_140 = pgVar44->nb[1];
                      sStack_148 = pgVar44->nb[2];
                      sStack_108 = pgVar44->nb[3];
                      gVar2 = pgVar48->type;
                      iVar3 = *(int *)&pgVar48->field_0x4;
                      pgStack_160 = (ggml_tensor *)0x12f413;
                      lVar53 = ggml_nrows(pgVar15);
                      lVar37 = ((long)iVar3 + -1 + lVar53) / (long)iVar3;
                      lVar34 = (int)gVar2 * lVar37;
                      sStack_120 = lVar37 + lVar34;
                      if (lVar53 <= (long)sStack_120) {
                        sStack_120 = lVar53;
                      }
                      if (lVar34 < (long)sStack_120) {
                        lStack_158 = lStack_158 * lStack_150;
                        do {
                          lVar53 = (lVar34 % lStack_158) / lStack_150;
                          lVar37 = (lVar34 % lStack_158) % lStack_150;
                          if (0 < lVar40) {
                            lVar52 = (lVar34 / lStack_158) * sStack_108;
                            lVar35 = lVar53 * sStack_148;
                            lVar39 = lVar37 * sStack_140;
                            lVar33 = (lVar34 / lStack_158) * sStack_138;
                            lVar53 = lVar53 * sStack_130;
                            lVar37 = lVar37 * sStack_128;
                            pvVar13 = pgStack_110->data;
                            pvVar14 = pgStack_118->data;
                            lVar36 = 0;
                            do {
                              fVar66 = *(float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)pvVar14 +
                                                         lVar36 * 2 + lVar53 + lVar37 + lVar33) * 4)
                              ;
                              if (fVar66 < 0.0) {
                                pgStack_160 = (ggml_tensor *)0x12f4e7;
                                fVar66 = sqrtf(fVar66);
                              }
                              else {
                                auVar69 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
                                fVar66 = auVar69._0_4_;
                              }
                              *(float *)((long)pvVar13 + lVar36 * 4 + lVar35 + lVar39 + lVar52) =
                                   fVar66;
                              lVar36 = lVar36 + 1;
                            } while (lVar40 != lVar36);
                          }
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != sStack_120);
                      }
                      return;
                    }
                    goto LAB_0012f86d;
                  }
LAB_0012f851:
                  pcVar38 = "nb0 == sizeof(dst_t)";
                  uVar42 = 0x55;
                  goto LAB_0012f887;
                }
              }
            }
          }
          pcVar38 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar42 = 0x51;
LAB_0012f887:
          pgStack_160 = (ggml_tensor *)0x12f88e;
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
        }
        cVar31 = ggml_is_contiguous_1(pgVar46);
        if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(pgVar43), cVar31 != '\0')) &&
           (cVar31 = ggml_are_same_shape(pgVar46,pgVar43), cVar31 != '\0')) {
          if (pgVar43->nb[0] == 4) {
            if (pgVar46->nb[0] == 2) {
              lVar40 = pgVar46->ne[1];
              lVar53 = pgVar46->ne[2];
              sVar7 = pgVar46->nb[1];
              sVar8 = pgVar46->nb[2];
              sVar9 = pgVar46->nb[3];
              lVar37 = pgVar43->ne[0];
              sVar10 = pgVar43->nb[1];
              sVar11 = pgVar43->nb[2];
              sVar12 = pgVar43->nb[3];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar33 = ggml_nrows(pgVar46);
              lVar34 = ((long)iVar3 + -1 + lVar33) / (long)iVar3;
              lVar52 = (int)gVar2 * lVar34;
              lVar34 = lVar34 + lVar52;
              if (lVar33 <= lVar34) {
                lVar34 = lVar33;
              }
              if (lVar52 < lVar34) {
                lVar53 = lVar53 * lVar40;
                pvVar13 = pgVar43->data;
                pvVar14 = pgVar46->data;
                do {
                  lVar33 = lVar52 / lVar53;
                  lVar39 = lVar52 % lVar53;
                  lVar35 = lVar39 / lVar40;
                  lVar39 = lVar39 % lVar40;
                  if (0 < lVar37) {
                    lVar36 = 0;
                    do {
                      *(float *)((long)pvVar13 +
                                lVar36 * 4 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12) =
                           *(float *)(&ggml_table_f32_f16 +
                                     (ulong)*(ushort *)
                                             ((long)pvVar14 +
                                             lVar36 * 2 +
                                             lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) * 4)
                           * *(float *)(&ggml_table_f32_f16 +
                                       (ulong)*(ushort *)
                                               ((long)pvVar14 +
                                               lVar36 * 2 +
                                               lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) * 4
                                       );
                      lVar36 = lVar36 + 1;
                    } while (lVar37 != lVar36);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 != lVar34);
              }
              return;
            }
            goto LAB_0012ef6d;
          }
LAB_0012ef51:
          pcVar38 = "nb0 == sizeof(dst_t)";
          uVar42 = 0x55;
          goto LAB_0012ef87;
        }
      }
      pcVar38 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar42 = 0x51;
LAB_0012ef87:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
    }
    cVar31 = ggml_is_contiguous_1(pgVar6);
    if (((cVar31 != '\0') && (cVar31 = ggml_is_contiguous_1(dst), cVar31 != '\0')) &&
       (cVar31 = ggml_are_same_shape(pgVar6,dst), cVar31 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar6->nb[0] == 2) {
          lVar40 = pgVar6->ne[1];
          lVar53 = pgVar6->ne[2];
          sVar7 = pgVar6->nb[1];
          sVar8 = pgVar6->nb[2];
          sVar9 = pgVar6->nb[3];
          lVar37 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar33 = ggml_nrows();
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar52 = iVar3 * lVar34;
          lVar34 = lVar34 + lVar52;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar52 < lVar34) {
            lVar53 = lVar53 * lVar40;
            pvVar13 = dst->data;
            pvVar14 = pgVar6->data;
            do {
              lVar33 = lVar52 / lVar53;
              lVar39 = lVar52 % lVar53;
              lVar35 = lVar39 / lVar40;
              lVar39 = lVar39 % lVar40;
              if (0 < lVar37) {
                lVar36 = 0;
                do {
                  auVar69._0_4_ =
                       (*(float *)(&ggml_table_f32_f16 +
                                  (ulong)*(ushort *)
                                          ((long)pvVar14 +
                                          lVar36 * 2 +
                                          lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) * 4) +
                       3.0) / 6.0;
                  auVar69._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar69 = vmaxss_avx(auVar69,ZEXT816(0) << 0x40);
                  auVar69 = vminss_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0));
                  *(float *)((long)pvVar13 +
                            lVar36 * 4 + lVar35 * sVar11 + lVar39 * sVar10 + lVar33 * sVar12) =
                       *(float *)(&ggml_table_f32_f16 +
                                 (ulong)*(ushort *)
                                         ((long)pvVar14 +
                                         lVar36 * 2 +
                                         lVar35 * sVar8 + lVar39 * sVar7 + lVar33 * sVar9) * 4) *
                       auVar69._0_4_;
                  lVar36 = lVar36 + 1;
                } while (lVar37 != lVar36);
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != lVar34);
          }
          return;
        }
        goto LAB_0012e6e5;
      }
LAB_0012e6c9:
      pcVar38 = "nb0 == sizeof(dst_t)";
      uVar42 = 0x55;
      goto LAB_0012e6ff;
    }
  }
  pcVar38 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar42 = 0x51;
LAB_0012e6ff:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
}

Assistant:

void ggml_compute_forward_hardswish(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_hardswish>(params, dst);
}